

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  BBox1f BVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [28];
  undefined1 auVar22 [28];
  undefined1 auVar23 [28];
  undefined1 auVar24 [28];
  int iVar25;
  int iVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar91 [16];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  int iVar137;
  undefined4 uVar138;
  vint4 bi_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  vint4 bi_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  vfloat4 a0;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  float fVar156;
  float fVar161;
  float fVar162;
  vfloat4 b0;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar163;
  vint4 ai;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar176;
  float fVar177;
  vint4 ai_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar186;
  float fVar191;
  vint4 ai_2;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  vfloat4 a0_3;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar227;
  float fVar228;
  vfloat4 b0_2;
  undefined1 auVar219 [16];
  float fVar229;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  vfloat4 a0_4;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  ulong local_368;
  Primitive *local_360;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar136;
  float fVar155;
  float fVar160;
  float fVar164;
  float fVar175;
  float fVar178;
  float fVar185;
  undefined1 auVar255 [32];
  
  uVar29 = (ulong)(byte)prim[1];
  lVar32 = uVar29 * 0x25;
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 4 + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 5 + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 6 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xf + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x11 + 6)));
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x1a + 6)));
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x1b + 6)));
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x1c + 6)));
  auVar118._16_16_ = in_YmmResult._16_16_;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar32 + 0x12)));
  auVar56 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar56 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar42 = vsubps_avx512vl(auVar56,*(undefined1 (*) [16])(prim + lVar32 + 6));
  fVar177 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar32 + 0x16)) *
            *(float *)(prim + lVar32 + 0x1a);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar29 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar56);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar29 * 0xb + 6);
  auVar60 = vpmovsxwd_avx(auVar59);
  auVar43 = vpbroadcastd_avx512vl();
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar29 * 9 + 6);
  auVar44 = vpmovsxwd_avx512vl(auVar58);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar29 * 0xd + 6);
  auVar45 = vpmovsxwd_avx512vl(auVar57);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar29 * 0x12 + 6);
  auVar62 = vpmovsxwd_avx(auVar62);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar29 * 0x16 + 6);
  auVar61 = vpmovsxwd_avx(auVar61);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar29 * 0x14 + 6);
  auVar65 = vpmovsxwd_avx(auVar65);
  auVar56 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar56 = vinsertps_avx512f(auVar56,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar42 = vmulps_avx512vl(auVar41,auVar42);
  auVar41 = vmulps_avx512vl(auVar41,auVar56);
  auVar46 = vcvtdq2ps_avx512vl(auVar52);
  auVar47 = vcvtdq2ps_avx512vl(auVar47);
  auVar48 = vcvtdq2ps_avx512vl(auVar48);
  auVar49 = vcvtdq2ps_avx512vl(auVar49);
  auVar50 = vcvtdq2ps_avx512vl(auVar50);
  auVar56 = vcvtdq2ps_avx(auVar51);
  auVar59 = vcvtdq2ps_avx(auVar53);
  auVar58 = vcvtdq2ps_avx(auVar54);
  auVar57 = vcvtdq2ps_avx(auVar55);
  auVar51 = vbroadcastss_avx512vl(auVar41);
  auVar52 = vshufps_avx512vl(auVar41,auVar41,0x55);
  auVar53 = vshufps_avx512vl(auVar41,auVar41,0xaa);
  auVar54 = vmulps_avx512vl(auVar53,auVar48);
  auVar66._0_4_ = auVar53._0_4_ * auVar56._0_4_;
  auVar66._4_4_ = auVar53._4_4_ * auVar56._4_4_;
  auVar66._8_4_ = auVar53._8_4_ * auVar56._8_4_;
  auVar66._12_4_ = auVar53._12_4_ * auVar56._12_4_;
  auVar41._0_4_ = auVar57._0_4_ * auVar53._0_4_;
  auVar41._4_4_ = auVar57._4_4_ * auVar53._4_4_;
  auVar41._8_4_ = auVar57._8_4_ * auVar53._8_4_;
  auVar41._12_4_ = auVar57._12_4_ * auVar53._12_4_;
  auVar53 = vfmadd231ps_avx512vl(auVar54,auVar52,auVar47);
  auVar54 = vfmadd231ps_avx512vl(auVar66,auVar52,auVar50);
  auVar52 = vfmadd231ps_fma(auVar41,auVar58,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar51,auVar46);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar49);
  auVar52 = vfmadd231ps_fma(auVar52,auVar59,auVar51);
  auVar51 = vbroadcastss_avx512vl(auVar42);
  auVar55 = vshufps_avx512vl(auVar42,auVar42,0x55);
  auVar41 = vshufps_avx512vl(auVar42,auVar42,0xaa);
  auVar48 = vmulps_avx512vl(auVar41,auVar48);
  auVar56 = vmulps_avx512vl(auVar41,auVar56);
  auVar57 = vmulps_avx512vl(auVar41,auVar57);
  auVar47 = vfmadd231ps_avx512vl(auVar48,auVar55,auVar47);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar55,auVar50);
  auVar58 = vfmadd231ps_avx512vl(auVar57,auVar55,auVar58);
  auVar41 = vfmadd231ps_avx512vl(auVar47,auVar51,auVar46);
  auVar266 = ZEXT1664(auVar41);
  auVar42 = vfmadd231ps_avx512vl(auVar56,auVar51,auVar49);
  auVar55 = vfmadd231ps_fma(auVar58,auVar51,auVar59);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar268 = ZEXT1664(auVar56);
  auVar59 = vandps_avx512vl(auVar53,auVar56);
  auVar70._8_4_ = 0x219392ef;
  auVar70._0_8_ = 0x219392ef219392ef;
  auVar70._12_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar59,auVar70,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar46._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar53._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar53._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar53._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar53._12_4_;
  auVar59 = vandps_avx512vl(auVar54,auVar56);
  uVar35 = vcmpps_avx512vl(auVar59,auVar70,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar63._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar54._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar54._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar54._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar54._12_4_;
  auVar56 = vandps_avx512vl(auVar52,auVar56);
  uVar35 = vcmpps_avx512vl(auVar56,auVar70,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar64._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar52._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar52._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar52._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar52._12_4_;
  auVar56 = vrcp14ps_avx512vl(auVar46);
  auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar269 = ZEXT1664(auVar59);
  auVar58 = vfnmadd213ps_avx512vl(auVar46,auVar56,auVar59);
  auVar58 = vfmadd132ps_fma(auVar58,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar63);
  auVar57 = vfnmadd213ps_avx512vl(auVar63,auVar56,auVar59);
  auVar57 = vfmadd132ps_fma(auVar57,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar64);
  auVar59 = vfnmadd213ps_avx512vl(auVar64,auVar56,auVar59);
  auVar51 = vfmadd132ps_fma(auVar59,auVar56,auVar56);
  auVar67._4_4_ = fVar177;
  auVar67._0_4_ = fVar177;
  auVar67._8_4_ = fVar177;
  auVar67._12_4_ = fVar177;
  auVar56 = vcvtdq2ps_avx(auVar75);
  auVar59 = vcvtdq2ps_avx(auVar60);
  auVar59 = vsubps_avx(auVar59,auVar56);
  auVar53 = vfmadd213ps_fma(auVar59,auVar67,auVar56);
  auVar59 = vcvtdq2ps_avx512vl(auVar44);
  auVar56 = vcvtdq2ps_avx512vl(auVar45);
  auVar56 = vsubps_avx(auVar56,auVar59);
  auVar54 = vfmadd213ps_fma(auVar56,auVar67,auVar59);
  auVar56 = vcvtdq2ps_avx(auVar62);
  auVar59 = vcvtdq2ps_avx(auVar61);
  auVar59 = vsubps_avx(auVar59,auVar56);
  auVar62 = vfmadd213ps_fma(auVar59,auVar67,auVar56);
  auVar56 = vcvtdq2ps_avx(auVar65);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar29 * 0x18 + 6);
  auVar59 = vpmovsxwd_avx(auVar52);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,auVar56);
  auVar61 = vfmadd213ps_fma(auVar59,auVar67,auVar56);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar29 * 0x1d + 6);
  auVar56 = vpmovsxwd_avx(auVar47);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar29 * 0x21 + 6);
  auVar59 = vpmovsxwd_avx(auVar48);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,auVar56);
  auVar65 = vfmadd213ps_fma(auVar59,auVar67,auVar56);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar29 * 0x1f + 6);
  auVar56 = vpmovsxwd_avx(auVar49);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar29 * 0x23 + 6);
  auVar59 = vpmovsxwd_avx(auVar50);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,auVar56);
  auVar59 = vfmadd213ps_fma(auVar59,auVar67,auVar56);
  auVar56 = vsubps_avx512vl(auVar53,auVar41);
  auVar68._0_4_ = auVar58._0_4_ * auVar56._0_4_;
  auVar68._4_4_ = auVar58._4_4_ * auVar56._4_4_;
  auVar68._8_4_ = auVar58._8_4_ * auVar56._8_4_;
  auVar68._12_4_ = auVar58._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx512vl(auVar54,auVar41);
  auVar44._0_4_ = auVar58._0_4_ * auVar56._0_4_;
  auVar44._4_4_ = auVar58._4_4_ * auVar56._4_4_;
  auVar44._8_4_ = auVar58._8_4_ * auVar56._8_4_;
  auVar44._12_4_ = auVar58._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar62,auVar42);
  auVar69._0_4_ = auVar57._0_4_ * auVar56._0_4_;
  auVar69._4_4_ = auVar57._4_4_ * auVar56._4_4_;
  auVar69._8_4_ = auVar57._8_4_ * auVar56._8_4_;
  auVar69._12_4_ = auVar57._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar61,auVar42);
  auVar60._0_4_ = auVar57._0_4_ * auVar56._0_4_;
  auVar60._4_4_ = auVar57._4_4_ * auVar56._4_4_;
  auVar60._8_4_ = auVar57._8_4_ * auVar56._8_4_;
  auVar60._12_4_ = auVar57._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar65,auVar55);
  auVar42._0_4_ = auVar51._0_4_ * auVar56._0_4_;
  auVar42._4_4_ = auVar51._4_4_ * auVar56._4_4_;
  auVar42._8_4_ = auVar51._8_4_ * auVar56._8_4_;
  auVar42._12_4_ = auVar51._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar59,auVar55);
  auVar75._0_4_ = auVar51._0_4_ * auVar56._0_4_;
  auVar75._4_4_ = auVar51._4_4_ * auVar56._4_4_;
  auVar75._8_4_ = auVar51._8_4_ * auVar56._8_4_;
  auVar75._12_4_ = auVar51._12_4_ * auVar56._12_4_;
  auVar56 = vpminsd_avx(auVar68,auVar44);
  auVar59 = vpminsd_avx(auVar69,auVar60);
  auVar56 = vmaxps_avx(auVar56,auVar59);
  auVar59 = vpminsd_avx(auVar42,auVar75);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar51._4_4_ = uVar138;
  auVar51._0_4_ = uVar138;
  auVar51._8_4_ = uVar138;
  auVar51._12_4_ = uVar138;
  auVar59 = vmaxps_avx512vl(auVar59,auVar51);
  auVar56 = vmaxps_avx(auVar56,auVar59);
  auVar53._8_4_ = 0x3f7ffffa;
  auVar53._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar53._12_4_ = 0x3f7ffffa;
  auVar58 = vmulps_avx512vl(auVar56,auVar53);
  auVar56 = vpmaxsd_avx(auVar68,auVar44);
  auVar59 = vpmaxsd_avx(auVar69,auVar60);
  auVar56 = vminps_avx(auVar56,auVar59);
  auVar59 = vpmaxsd_avx(auVar42,auVar75);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar54._4_4_ = uVar138;
  auVar54._0_4_ = uVar138;
  auVar54._8_4_ = uVar138;
  auVar54._12_4_ = uVar138;
  auVar59 = vminps_avx512vl(auVar59,auVar54);
  auVar56 = vminps_avx(auVar56,auVar59);
  auVar55._8_4_ = 0x3f800003;
  auVar55._0_8_ = 0x3f8000033f800003;
  auVar55._12_4_ = 0x3f800003;
  auVar56 = vmulps_avx512vl(auVar56,auVar55);
  uVar13 = vcmpps_avx512vl(auVar58,auVar56,2);
  uVar14 = vpcmpgtd_avx512vl(auVar43,_DAT_01f4ad30);
  uVar35 = (ulong)((byte)uVar13 & 0xf & (byte)uVar14);
  auVar56 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar59 = vpxord_avx512vl(auVar45,auVar45);
  auVar263 = ZEXT1664(auVar59);
  auVar118._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar271 = ZEXT1664(auVar118._0_16_);
  local_360 = prim;
LAB_018f4bed:
  if (uVar35 == 0) {
    return;
  }
  lVar32 = 0;
  for (uVar29 = uVar35; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar29 = (ulong)*(uint *)(local_360 + 2);
  pGVar7 = (context->scene->geometries).items[uVar29].ptr;
  fVar177 = (pGVar7->time_range).lower;
  fVar232 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar177) / ((pGVar7->time_range).upper - fVar177));
  auVar59 = vroundss_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),9);
  uVar6 = *(uint *)(local_360 + lVar32 * 4 + 6);
  auVar114._16_16_ = auVar118._16_16_;
  auVar57 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar59 = vminss_avx(auVar59,auVar57);
  auVar60 = vmaxss_avx512f(auVar263._0_16_,auVar59);
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar6 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar33 = (long)(int)auVar60._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar33);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar33);
  auVar59 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar30);
  lVar32 = uVar30 + 1;
  auVar57 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar32);
  lVar1 = uVar30 + 2;
  auVar62 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar30 + 3;
  auVar61 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar33);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar33);
  auVar65 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar30);
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar32);
  auVar47 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar33);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar33);
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar30);
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar32);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar33);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar33);
  auVar54 = *(undefined1 (*) [16])(lVar10 + uVar30 * lVar9);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar32 * lVar9);
  auVar75 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  fVar232 = fVar232 - auVar60._0_4_;
  auVar114._0_16_ = vxorps_avx512vl(auVar266._0_16_,auVar266._0_16_);
  auVar60 = vmulps_avx512vl(auVar61,auVar114._0_16_);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar42 = vfmadd213ps_avx512vl(auVar41,auVar62,auVar60);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar57,auVar43);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar59,auVar41);
  auVar66 = auVar271._0_16_;
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar62,auVar66);
  auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar57,auVar114._0_16_);
  auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar59,auVar66);
  auVar44 = vmulps_avx512vl(auVar48,auVar114._0_16_);
  auVar45 = vfmadd213ps_avx512vl(auVar41,auVar47,auVar44);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar43);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar65,auVar41);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar47,auVar66);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar52,auVar114._0_16_);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar65,auVar66);
  auVar46 = vmulps_avx512vl(auVar61,auVar41);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar62,auVar43);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar57,auVar41);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar59,auVar114._0_16_);
  auVar61 = vmulps_avx512vl(auVar61,auVar66);
  auVar62 = vfmadd231ps_avx512vl(auVar61,auVar114._0_16_,auVar62);
  auVar57 = vfnmadd231ps_avx512vl(auVar62,auVar66,auVar57);
  auVar63 = vfnmadd231ps_avx512vl(auVar57,auVar114._0_16_,auVar59);
  auVar59 = vmulps_avx512vl(auVar48,auVar41);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar47,auVar43);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar52,auVar41);
  auVar64 = vfmadd231ps_avx512vl(auVar59,auVar65,auVar114._0_16_);
  auVar59 = vmulps_avx512vl(auVar48,auVar66);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar114._0_16_,auVar47);
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar66,auVar52);
  auVar52 = vfnmadd231ps_avx512vl(auVar59,auVar114._0_16_,auVar65);
  auVar57 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  auVar59 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar59 = vmulps_avx512vl(auVar60,auVar59);
  auVar59 = vfmsub231ps_avx512vl(auVar59,auVar57,auVar45);
  auVar62 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar59 = vmulps_avx512vl(auVar60,auVar59);
  auVar59 = vfmsub231ps_fma(auVar59,auVar57,auVar44);
  auVar61 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar57 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar83._0_4_ = auVar63._0_4_ * auVar57._0_4_;
  auVar83._4_4_ = auVar63._4_4_ * auVar57._4_4_;
  auVar83._8_4_ = auVar63._8_4_ * auVar57._8_4_;
  auVar83._12_4_ = auVar63._12_4_ * auVar57._12_4_;
  auVar57 = vfmsub231ps_fma(auVar83,auVar59,auVar64);
  auVar65 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar57 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar84._0_4_ = auVar63._0_4_ * auVar57._0_4_;
  auVar84._4_4_ = auVar63._4_4_ * auVar57._4_4_;
  auVar84._8_4_ = auVar63._8_4_ * auVar57._8_4_;
  auVar84._12_4_ = auVar63._12_4_ * auVar57._12_4_;
  auVar59 = vfmsub231ps_fma(auVar84,auVar59,auVar52);
  auVar52 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vdpps_avx(auVar62,auVar62,0x7f);
  auVar99._4_28_ = auVar114._4_28_;
  auVar99._0_4_ = auVar59._0_4_;
  auVar57 = vrsqrt14ss_avx512f(auVar114._0_16_,auVar99._0_16_);
  auVar47 = vmulss_avx512f(auVar57,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar59,ZEXT416(0xbf000000));
  auVar48 = vmulss_avx512f(auVar48,auVar57);
  auVar57 = vmulss_avx512f(auVar48,ZEXT416((uint)(auVar57._0_4_ * auVar57._0_4_)));
  fVar177 = auVar47._0_4_ + auVar57._0_4_;
  auVar192._4_4_ = fVar177;
  auVar192._0_4_ = fVar177;
  auVar192._8_4_ = fVar177;
  auVar192._12_4_ = fVar177;
  auVar57 = vdpps_avx(auVar62,auVar61,0x7f);
  auVar47 = vmulps_avx512vl(auVar62,auVar192);
  auVar48 = vbroadcastss_avx512vl(auVar59);
  auVar61 = vmulps_avx512vl(auVar48,auVar61);
  fVar176 = auVar57._0_4_;
  auVar165._0_4_ = fVar176 * auVar62._0_4_;
  auVar165._4_4_ = fVar176 * auVar62._4_4_;
  auVar165._8_4_ = fVar176 * auVar62._8_4_;
  auVar165._12_4_ = fVar176 * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar61,auVar165);
  auVar57 = vrcp14ss_avx512f(auVar114._0_16_,auVar99._0_16_);
  auVar59 = vfnmadd213ss_avx512f(auVar59,auVar57,ZEXT416(0x40000000));
  fVar218 = auVar57._0_4_ * auVar59._0_4_;
  auVar59 = vdpps_avx(auVar65,auVar65,0x7f);
  auVar117._16_16_ = auVar114._16_16_;
  auVar117._0_16_ = auVar114._0_16_;
  auVar100._4_28_ = auVar117._4_28_;
  auVar100._0_4_ = auVar59._0_4_;
  auVar57 = vrsqrt14ss_avx512f(auVar114._0_16_,auVar100._0_16_);
  auVar61 = vmulss_avx512f(auVar57,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar59,ZEXT416(0xbf000000));
  fVar176 = auVar57._0_4_;
  fVar176 = auVar61._0_4_ + auVar48._0_4_ * fVar176 * fVar176 * fVar176;
  auVar87._0_4_ = auVar65._0_4_ * fVar176;
  auVar87._4_4_ = auVar65._4_4_ * fVar176;
  auVar87._8_4_ = auVar65._8_4_ * fVar176;
  auVar87._12_4_ = auVar65._12_4_ * fVar176;
  auVar57 = vdpps_avx(auVar65,auVar52,0x7f);
  auVar61 = vbroadcastss_avx512vl(auVar59);
  auVar61 = vmulps_avx512vl(auVar61,auVar52);
  fVar227 = auVar57._0_4_;
  auVar45._0_4_ = fVar227 * auVar65._0_4_;
  auVar45._4_4_ = fVar227 * auVar65._4_4_;
  auVar45._8_4_ = fVar227 * auVar65._8_4_;
  auVar45._12_4_ = fVar227 * auVar65._12_4_;
  auVar57 = vsubps_avx(auVar61,auVar45);
  auVar61 = vrcp14ss_avx512f(auVar114._0_16_,auVar100._0_16_);
  auVar59 = vfnmadd213ss_avx512f(auVar59,auVar61,ZEXT416(0x40000000));
  fVar227 = auVar61._0_4_ * auVar59._0_4_;
  auVar59 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar61 = vmulps_avx512vl(auVar59,auVar47);
  auVar44 = vsubps_avx512vl(auVar42,auVar61);
  auVar65 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar65 = vmulps_avx512vl(auVar65,auVar47);
  auVar80._0_4_ = auVar65._0_4_ + auVar59._0_4_ * fVar177 * fVar218 * auVar62._0_4_;
  auVar80._4_4_ = auVar65._4_4_ + auVar59._4_4_ * fVar177 * fVar218 * auVar62._4_4_;
  auVar80._8_4_ = auVar65._8_4_ + auVar59._8_4_ * fVar177 * fVar218 * auVar62._8_4_;
  auVar80._12_4_ = auVar65._12_4_ + auVar59._12_4_ * fVar177 * fVar218 * auVar62._12_4_;
  auVar62 = vsubps_avx512vl(auVar60,auVar80);
  auVar42 = vaddps_avx512vl(auVar42,auVar61);
  auVar61 = vaddps_avx512vl(auVar60,auVar80);
  auVar59 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar65 = vmulps_avx512vl(auVar59,auVar87);
  auVar60 = vsubps_avx512vl(auVar46,auVar65);
  auVar52 = vshufps_avx512vl(auVar63,auVar63,0xff);
  auVar52 = vmulps_avx512vl(auVar52,auVar87);
  auVar88._0_4_ = auVar52._0_4_ + auVar59._0_4_ * fVar176 * auVar57._0_4_ * fVar227;
  auVar88._4_4_ = auVar52._4_4_ + auVar59._4_4_ * fVar176 * auVar57._4_4_ * fVar227;
  auVar88._8_4_ = auVar52._8_4_ + auVar59._8_4_ * fVar176 * auVar57._8_4_ * fVar227;
  auVar88._12_4_ = auVar52._12_4_ + auVar59._12_4_ * fVar176 * auVar57._12_4_ * fVar227;
  auVar59 = vsubps_avx(auVar63,auVar88);
  auVar45 = vaddps_avx512vl(auVar46,auVar65);
  auVar57 = vaddps_avx512vl(auVar63,auVar88);
  auVar71._8_4_ = 0x3eaaaaab;
  auVar71._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar71._12_4_ = 0x3eaaaaab;
  auVar91._0_4_ = auVar44._0_4_ + auVar62._0_4_ * 0.33333334;
  auVar91._4_4_ = auVar44._4_4_ + auVar62._4_4_ * 0.33333334;
  auVar91._8_4_ = auVar44._8_4_ + auVar62._8_4_ * 0.33333334;
  auVar91._12_4_ = auVar44._12_4_ + auVar62._12_4_ * 0.33333334;
  auVar86._0_4_ = auVar59._0_4_ * 0.33333334;
  auVar86._4_4_ = auVar59._4_4_ * 0.33333334;
  auVar86._8_4_ = auVar59._8_4_ * 0.33333334;
  auVar86._12_4_ = auVar59._12_4_ * 0.33333334;
  auVar47 = vsubps_avx(auVar60,auVar86);
  p01.field_0.v[1] = auVar42._4_4_ + auVar61._4_4_ * 0.33333334;
  p01.field_0.v[0] = auVar42._0_4_ + auVar61._0_4_ * 0.33333334;
  p01.field_0.v[2] = auVar42._8_4_ + auVar61._8_4_ * 0.33333334;
  p01.field_0.v[3] = auVar42._12_4_ + auVar61._12_4_ * 0.33333334;
  auVar59 = vmulps_avx512vl(auVar57,auVar71);
  auVar48 = vsubps_avx(auVar45,auVar59);
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar57 = vmulps_avx512vl(auVar53,auVar114._0_16_);
  auVar62 = vfmadd213ps_avx512vl(auVar41,auVar51,auVar57);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar50,auVar43);
  auVar46 = vfmadd231ps_avx512vl(auVar62,auVar49,auVar41);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar51,auVar66);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar50,auVar114._0_16_);
  auVar63 = vfnmadd231ps_avx512vl(auVar57,auVar49,auVar66);
  auVar57 = vmulps_avx512vl(auVar59,auVar114._0_16_);
  auVar62 = vfmadd213ps_avx512vl(auVar41,auVar75,auVar57);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar55,auVar43);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar54,auVar41);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar75,auVar66);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar55,auVar114._0_16_);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar54,auVar66);
  auVar61 = vmulps_avx512vl(auVar53,auVar41);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar51,auVar43);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar50,auVar41);
  auVar64 = vfmadd231ps_avx512vl(auVar61,auVar49,auVar114._0_16_);
  auVar61 = vmulps_avx512vl(auVar53,auVar66);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar114._0_16_,auVar51);
  auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar66,auVar50);
  auVar49 = vfnmadd231ps_avx512vl(auVar61,auVar114._0_16_,auVar49);
  auVar61 = vmulps_avx512vl(auVar59,auVar41);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar75,auVar43);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar55,auVar41);
  auVar65 = vfmadd231ps_avx512vl(auVar61,auVar54,auVar114._0_16_);
  auVar59 = vmulps_avx512vl(auVar59,auVar66);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar114._0_16_,auVar75);
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar66,auVar55);
  auVar52 = vfnmadd231ps_avx512vl(auVar59,auVar114._0_16_,auVar54);
  auVar59 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar61 = vshufps_avx512vl(auVar62,auVar62,0xc9);
  fVar227 = auVar63._0_4_;
  auVar233._0_4_ = fVar227 * auVar61._0_4_;
  fVar228 = auVar63._4_4_;
  auVar233._4_4_ = fVar228 * auVar61._4_4_;
  fVar155 = auVar63._8_4_;
  auVar233._8_4_ = fVar155 * auVar61._8_4_;
  fVar160 = auVar63._12_4_;
  auVar233._12_4_ = fVar160 * auVar61._12_4_;
  auVar62 = vfmsub231ps_avx512vl(auVar233,auVar59,auVar62);
  auVar62 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar61 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  auVar242._0_4_ = fVar227 * auVar61._0_4_;
  auVar242._4_4_ = fVar228 * auVar61._4_4_;
  auVar242._8_4_ = fVar155 * auVar61._8_4_;
  auVar242._12_4_ = fVar160 * auVar61._12_4_;
  auVar59 = vfmsub231ps_avx512vl(auVar242,auVar59,auVar57);
  auVar61 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar50 = vshufps_avx512vl(auVar49,auVar49,0xc9);
  auVar59 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar59 = vmulps_avx512vl(auVar49,auVar59);
  auVar59 = vfmsub231ps_fma(auVar59,auVar50,auVar65);
  auVar65 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar57 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar59 = vdpps_avx(auVar62,auVar62,0x7f);
  auVar57 = vmulps_avx512vl(auVar49,auVar57);
  auVar57 = vfmsub231ps_fma(auVar57,auVar50,auVar52);
  auVar52 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar101._16_16_ = auVar114._16_16_;
  auVar101._0_16_ = auVar114._0_16_;
  auVar102._4_28_ = auVar101._4_28_;
  auVar102._0_4_ = auVar59._0_4_;
  auVar57 = vrsqrt14ss_avx512f(auVar114._0_16_,auVar102._0_16_);
  auVar50 = vmulss_avx512f(auVar57,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar59,ZEXT416(0xbf000000));
  auVar51 = vmulss_avx512f(auVar51,auVar57);
  auVar57 = vmulss_avx512f(auVar51,ZEXT416((uint)(auVar57._0_4_ * auVar57._0_4_)));
  auVar57 = vaddss_avx512f(auVar50,auVar57);
  auVar256._0_4_ = auVar57._0_4_;
  auVar256._4_4_ = auVar256._0_4_;
  auVar256._8_4_ = auVar256._0_4_;
  auVar256._12_4_ = auVar256._0_4_;
  auVar50 = vmulps_avx512vl(auVar62,auVar256);
  auVar57 = vdpps_avx(auVar62,auVar61,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar59);
  auVar61 = vmulps_avx512vl(auVar51,auVar61);
  fVar177 = auVar57._0_4_;
  auVar97._0_4_ = auVar62._0_4_ * fVar177;
  auVar97._4_4_ = auVar62._4_4_ * fVar177;
  auVar97._8_4_ = auVar62._8_4_ * fVar177;
  auVar97._12_4_ = auVar62._12_4_ * fVar177;
  auVar62 = vsubps_avx(auVar61,auVar97);
  auVar57 = vrcp14ss_avx512f(auVar114._0_16_,auVar102._0_16_);
  auVar59 = vfnmadd213ss_avx512f(auVar59,auVar57,ZEXT416(0x40000000));
  fVar176 = auVar57._0_4_ * auVar59._0_4_;
  auVar59 = vdpps_avx(auVar65,auVar65,0x7f);
  auVar103._16_16_ = auVar114._16_16_;
  auVar103._0_16_ = auVar114._0_16_;
  auVar104._4_28_ = auVar103._4_28_;
  auVar104._0_4_ = auVar59._0_4_;
  auVar57 = vrsqrt14ss_avx512f(auVar114._0_16_,auVar104._0_16_);
  auVar61 = vmulss_avx512f(auVar57,ZEXT416(0x3fc00000));
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar51 = vmulss_avx512f(auVar59,ZEXT416(0xbf000000));
  auVar270 = ZEXT464(0x3f800000);
  fVar177 = auVar57._0_4_;
  fVar177 = auVar61._0_4_ + auVar51._0_4_ * fVar177 * fVar177 * fVar177;
  auVar250._0_4_ = auVar65._0_4_ * fVar177;
  auVar250._4_4_ = auVar65._4_4_ * fVar177;
  auVar250._8_4_ = auVar65._8_4_ * fVar177;
  auVar250._12_4_ = auVar65._12_4_ * fVar177;
  auVar57 = vdpps_avx(auVar65,auVar52,0x7f);
  auVar61 = vbroadcastss_avx512vl(auVar59);
  auVar61 = vmulps_avx512vl(auVar61,auVar52);
  fVar218 = auVar57._0_4_;
  auVar209._0_4_ = fVar218 * auVar65._0_4_;
  auVar209._4_4_ = fVar218 * auVar65._4_4_;
  auVar209._8_4_ = fVar218 * auVar65._8_4_;
  auVar209._12_4_ = fVar218 * auVar65._12_4_;
  auVar57 = vsubps_avx(auVar61,auVar209);
  auVar61 = vrcp14ss_avx512f(auVar114._0_16_,auVar104._0_16_);
  auVar59 = vfnmadd213ss_avx512f(auVar59,auVar61,ZEXT416(0x40000000));
  fVar218 = auVar59._0_4_ * auVar61._0_4_;
  auVar61 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar65 = vmulps_avx512vl(auVar61,auVar50);
  auVar52 = vsubps_avx512vl(auVar46,auVar65);
  auVar59 = vshufps_avx(auVar63,auVar63,0xff);
  auVar59 = vmulps_avx512vl(auVar59,auVar50);
  auVar85._0_4_ = auVar59._0_4_ + auVar61._0_4_ * auVar256._0_4_ * fVar176 * auVar62._0_4_;
  auVar85._4_4_ = auVar59._4_4_ + auVar61._4_4_ * auVar256._0_4_ * fVar176 * auVar62._4_4_;
  auVar85._8_4_ = auVar59._8_4_ + auVar61._8_4_ * auVar256._0_4_ * fVar176 * auVar62._8_4_;
  auVar85._12_4_ = auVar59._12_4_ + auVar61._12_4_ * auVar256._0_4_ * fVar176 * auVar62._12_4_;
  auVar59 = vsubps_avx(auVar63,auVar85);
  auVar62 = vaddps_avx512vl(auVar46,auVar65);
  auVar61 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar243._0_4_ = auVar61._0_4_ * auVar250._0_4_;
  auVar243._4_4_ = auVar61._4_4_ * auVar250._4_4_;
  auVar243._8_4_ = auVar61._8_4_ * auVar250._8_4_;
  auVar243._12_4_ = auVar61._12_4_ * auVar250._12_4_;
  auVar65 = vsubps_avx512vl(auVar64,auVar243);
  auVar50 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar50 = vmulps_avx512vl(auVar50,auVar250);
  auVar94._0_4_ = auVar50._0_4_ + auVar61._0_4_ * fVar177 * auVar57._0_4_ * fVar218;
  auVar94._4_4_ = auVar50._4_4_ + auVar61._4_4_ * fVar177 * auVar57._4_4_ * fVar218;
  auVar94._8_4_ = auVar50._8_4_ + auVar61._8_4_ * fVar177 * auVar57._8_4_ * fVar218;
  auVar94._12_4_ = auVar50._12_4_ + auVar61._12_4_ * fVar177 * auVar57._12_4_ * fVar218;
  auVar57 = vsubps_avx512vl(auVar49,auVar94);
  auVar61 = vaddps_avx512vl(auVar64,auVar243);
  auVar49 = vaddps_avx512vl(auVar49,auVar94);
  auVar210._0_4_ = auVar52._0_4_ + auVar59._0_4_ * 0.33333334;
  auVar210._4_4_ = auVar52._4_4_ + auVar59._4_4_ * 0.33333334;
  auVar210._8_4_ = auVar52._8_4_ + auVar59._8_4_ * 0.33333334;
  auVar210._12_4_ = auVar52._12_4_ + auVar59._12_4_ * 0.33333334;
  auVar199._0_4_ = auVar57._0_4_ * 0.33333334;
  auVar199._4_4_ = auVar57._4_4_ * 0.33333334;
  auVar199._8_4_ = auVar57._8_4_ * 0.33333334;
  auVar199._12_4_ = auVar57._12_4_ * 0.33333334;
  auVar59 = vsubps_avx(auVar65,auVar199);
  auVar82._0_4_ = auVar62._0_4_ + (fVar227 + auVar85._0_4_) * 0.33333334;
  auVar82._4_4_ = auVar62._4_4_ + (fVar228 + auVar85._4_4_) * 0.33333334;
  auVar82._8_4_ = auVar62._8_4_ + (fVar155 + auVar85._8_4_) * 0.33333334;
  auVar82._12_4_ = auVar62._12_4_ + (fVar160 + auVar85._12_4_) * 0.33333334;
  auVar89._0_4_ = auVar49._0_4_ * 0.33333334;
  auVar89._4_4_ = auVar49._4_4_ * 0.33333334;
  auVar89._8_4_ = auVar49._8_4_ * 0.33333334;
  auVar89._12_4_ = auVar49._12_4_ * 0.33333334;
  auVar57 = vsubps_avx(auVar61,auVar89);
  auVar251._4_4_ = fVar232;
  auVar251._0_4_ = fVar232;
  auVar251._8_4_ = fVar232;
  auVar251._12_4_ = fVar232;
  auVar49 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar232));
  auVar72._0_4_ = auVar49._0_4_;
  auVar72._4_4_ = auVar72._0_4_;
  auVar72._8_4_ = auVar72._0_4_;
  auVar72._12_4_ = auVar72._0_4_;
  auVar52 = vmulps_avx512vl(auVar251,auVar52);
  auVar49 = vmulps_avx512vl(auVar251,auVar210);
  auVar59 = vmulps_avx512vl(auVar251,auVar59);
  auVar257._0_4_ = fVar232 * auVar65._0_4_;
  auVar257._4_4_ = fVar232 * auVar65._4_4_;
  auVar257._8_4_ = fVar232 * auVar65._8_4_;
  auVar257._12_4_ = fVar232 * auVar65._12_4_;
  auVar46 = vfmadd231ps_avx512vl(auVar52,auVar72,auVar44);
  auVar63 = vfmadd231ps_avx512vl(auVar49,auVar72,auVar91);
  auVar64 = vfmadd231ps_avx512vl(auVar59,auVar72,auVar47);
  auVar50 = vfmadd231ps_fma(auVar257,auVar72,auVar60);
  auVar59 = vmulps_avx512vl(auVar251,auVar62);
  auVar62 = vmulps_avx512vl(auVar251,auVar82);
  auVar57 = vmulps_avx512vl(auVar251,auVar57);
  auVar244._0_4_ = fVar232 * auVar61._0_4_;
  auVar244._4_4_ = fVar232 * auVar61._4_4_;
  auVar244._8_4_ = fVar232 * auVar61._8_4_;
  auVar244._12_4_ = fVar232 * auVar61._12_4_;
  auVar66 = vfmadd231ps_avx512vl(auVar59,auVar72,auVar42);
  auVar67 = vfmadd231ps_avx512vl(auVar62,auVar72,(undefined1  [16])p01.field_0);
  auVar68 = vfmadd231ps_avx512vl(auVar57,auVar72,auVar48);
  auVar51 = vfmadd231ps_fma(auVar244,auVar72,auVar45);
  auVar59 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar59 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar177 = *(float *)(ray + k * 4 + 0x30);
  auVar45 = vsubps_avx512vl(auVar46,auVar59);
  uVar138 = auVar45._0_4_;
  auVar74._4_4_ = uVar138;
  auVar74._0_4_ = uVar138;
  auVar74._8_4_ = uVar138;
  auVar74._12_4_ = uVar138;
  auVar57 = vshufps_avx(auVar45,auVar45,0x55);
  auVar62 = vshufps_avx(auVar45,auVar45,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar176 = pre->ray_space[k].vz.field_0.m128[0];
  fVar232 = pre->ray_space[k].vz.field_0.m128[1];
  fVar218 = pre->ray_space[k].vz.field_0.m128[2];
  fVar227 = pre->ray_space[k].vz.field_0.m128[3];
  auVar73._0_4_ = fVar176 * auVar62._0_4_;
  auVar73._4_4_ = fVar232 * auVar62._4_4_;
  auVar73._8_4_ = fVar218 * auVar62._8_4_;
  auVar73._12_4_ = fVar227 * auVar62._12_4_;
  auVar57 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar5,auVar57);
  auVar53 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar4,auVar74);
  auVar69 = vsubps_avx512vl(auVar63,auVar59);
  uVar138 = auVar69._0_4_;
  auVar78._4_4_ = uVar138;
  auVar78._0_4_ = uVar138;
  auVar78._8_4_ = uVar138;
  auVar78._12_4_ = uVar138;
  auVar57 = vshufps_avx(auVar69,auVar69,0x55);
  auVar62 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar76._0_4_ = fVar176 * auVar62._0_4_;
  auVar76._4_4_ = fVar232 * auVar62._4_4_;
  auVar76._8_4_ = fVar218 * auVar62._8_4_;
  auVar76._12_4_ = fVar227 * auVar62._12_4_;
  auVar57 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar5,auVar57);
  auVar54 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar4,auVar78);
  auVar70 = vsubps_avx512vl(auVar64,auVar59);
  uVar138 = auVar70._0_4_;
  auVar90._4_4_ = uVar138;
  auVar90._0_4_ = uVar138;
  auVar90._8_4_ = uVar138;
  auVar90._12_4_ = uVar138;
  auVar57 = vshufps_avx(auVar70,auVar70,0x55);
  auVar62 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar79._0_4_ = fVar176 * auVar62._0_4_;
  auVar79._4_4_ = fVar232 * auVar62._4_4_;
  auVar79._8_4_ = fVar218 * auVar62._8_4_;
  auVar79._12_4_ = fVar227 * auVar62._12_4_;
  auVar57 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar57);
  auVar55 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar4,auVar90);
  auVar47 = vsubps_avx(auVar50,auVar59);
  uVar138 = auVar47._0_4_;
  auVar95._4_4_ = uVar138;
  auVar95._0_4_ = uVar138;
  auVar95._8_4_ = uVar138;
  auVar95._12_4_ = uVar138;
  auVar57 = vshufps_avx(auVar47,auVar47,0x55);
  auVar62 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar93._0_4_ = fVar176 * auVar62._0_4_;
  auVar93._4_4_ = fVar232 * auVar62._4_4_;
  auVar93._8_4_ = fVar218 * auVar62._8_4_;
  auVar93._12_4_ = fVar227 * auVar62._12_4_;
  auVar57 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar5,auVar57);
  auVar75 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar4,auVar95);
  auVar71 = vsubps_avx512vl(auVar66,auVar59);
  uVar138 = auVar71._0_4_;
  auVar96._4_4_ = uVar138;
  auVar96._0_4_ = uVar138;
  auVar96._8_4_ = uVar138;
  auVar96._12_4_ = uVar138;
  auVar57 = vshufps_avx(auVar71,auVar71,0x55);
  auVar62 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar211._0_4_ = auVar62._0_4_ * fVar176;
  auVar211._4_4_ = auVar62._4_4_ * fVar232;
  auVar211._8_4_ = auVar62._8_4_ * fVar218;
  auVar211._12_4_ = auVar62._12_4_ * fVar227;
  auVar57 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar5,auVar57);
  auVar60 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar4,auVar96);
  auVar72 = vsubps_avx512vl(auVar67,auVar59);
  uVar138 = auVar72._0_4_;
  auVar193._4_4_ = uVar138;
  auVar193._0_4_ = uVar138;
  auVar193._8_4_ = uVar138;
  auVar193._12_4_ = uVar138;
  auVar57 = vshufps_avx(auVar72,auVar72,0x55);
  auVar62 = vshufps_avx(auVar72,auVar72,0xaa);
  auVar219._0_4_ = auVar62._0_4_ * fVar176;
  auVar219._4_4_ = auVar62._4_4_ * fVar232;
  auVar219._8_4_ = auVar62._8_4_ * fVar218;
  auVar219._12_4_ = auVar62._12_4_ * fVar227;
  auVar57 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar5,auVar57);
  auVar41 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar4,auVar193);
  auVar73 = vsubps_avx512vl(auVar68,auVar59);
  uVar138 = auVar73._0_4_;
  auVar194._4_4_ = uVar138;
  auVar194._0_4_ = uVar138;
  auVar194._8_4_ = uVar138;
  auVar194._12_4_ = uVar138;
  auVar57 = vshufps_avx(auVar73,auVar73,0x55);
  auVar62 = vshufps_avx(auVar73,auVar73,0xaa);
  auVar234._0_4_ = auVar62._0_4_ * fVar176;
  auVar234._4_4_ = auVar62._4_4_ * fVar232;
  auVar234._8_4_ = auVar62._8_4_ * fVar218;
  auVar234._12_4_ = auVar62._12_4_ * fVar227;
  auVar57 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar5,auVar57);
  auVar42 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar4,auVar194);
  auVar48 = vsubps_avx(auVar51,auVar59);
  uVar138 = auVar48._0_4_;
  auVar81._4_4_ = uVar138;
  auVar81._0_4_ = uVar138;
  auVar81._8_4_ = uVar138;
  auVar81._12_4_ = uVar138;
  auVar59 = vshufps_avx(auVar48,auVar48,0x55);
  auVar57 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar92._0_4_ = auVar57._0_4_ * fVar176;
  auVar92._4_4_ = auVar57._4_4_ * fVar232;
  auVar92._8_4_ = auVar57._8_4_ * fVar218;
  auVar92._12_4_ = auVar57._12_4_ * fVar227;
  auVar59 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar59);
  auVar44 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar4,auVar81);
  auVar62 = vmovlhps_avx(auVar53,auVar60);
  auVar61 = vmovlhps_avx(auVar54,auVar41);
  auVar65 = vmovlhps_avx(auVar55,auVar42);
  auVar49 = vmovlhps_avx512f(auVar75,auVar44);
  auVar57 = vminps_avx(auVar62,auVar61);
  auVar59 = vmaxps_avx(auVar62,auVar61);
  auVar52 = vminps_avx512vl(auVar65,auVar49);
  auVar57 = vminps_avx(auVar57,auVar52);
  auVar52 = vmaxps_avx512vl(auVar65,auVar49);
  auVar59 = vmaxps_avx(auVar59,auVar52);
  auVar52 = vshufpd_avx(auVar57,auVar57,3);
  auVar57 = vminps_avx(auVar57,auVar52);
  auVar52 = vshufpd_avx(auVar59,auVar59,3);
  auVar59 = vmaxps_avx(auVar59,auVar52);
  auVar57 = vandps_avx512vl(auVar57,auVar268._0_16_);
  auVar59 = vandps_avx512vl(auVar59,auVar268._0_16_);
  auVar59 = vmaxps_avx(auVar57,auVar59);
  auVar57 = vmovshdup_avx(auVar59);
  auVar59 = vmaxss_avx(auVar57,auVar59);
  fVar176 = auVar59._0_4_ * 9.536743e-07;
  auVar74 = vmovddup_avx512vl(auVar53);
  auVar54 = vmovddup_avx512vl(auVar54);
  auVar55 = vmovddup_avx512vl(auVar55);
  auVar75 = vmovddup_avx512vl(auVar75);
  auVar77._4_4_ = fVar176;
  auVar77._0_4_ = fVar176;
  auVar77._8_4_ = fVar176;
  auVar77._12_4_ = fVar176;
  auVar144._16_4_ = fVar176;
  auVar144._0_16_ = auVar77;
  auVar144._20_4_ = fVar176;
  auVar144._24_4_ = fVar176;
  auVar144._28_4_ = fVar176;
  auVar59 = vxorps_avx512vl(auVar77,auVar43);
  local_78 = auVar59._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  uVar30 = 0;
  auVar59 = vsubps_avx(auVar61,auVar62);
  auVar57 = vsubps_avx(auVar65,auVar61);
  auVar76 = vsubps_avx512vl(auVar49,auVar65);
  auVar77 = vsubps_avx512vl(auVar66,auVar46);
  auVar78 = vsubps_avx512vl(auVar67,auVar63);
  auVar79 = vsubps_avx512vl(auVar68,auVar64);
  auVar52 = vsubps_avx(auVar51,auVar50);
  auVar80 = vpbroadcastd_avx512vl();
  auVar81 = vpbroadcastd_avx512vl();
  auVar53 = ZEXT816(0x3f80000000000000);
  auVar43 = auVar53;
LAB_018f5747:
  do {
    auVar165 = vshufps_avx(auVar43,auVar43,0x50);
    auVar252._8_4_ = 0x3f800000;
    auVar252._0_8_ = 0x3f8000003f800000;
    auVar252._12_4_ = 0x3f800000;
    auVar255._16_4_ = 0x3f800000;
    auVar255._0_16_ = auVar252;
    auVar255._20_4_ = 0x3f800000;
    auVar255._24_4_ = 0x3f800000;
    auVar255._28_4_ = 0x3f800000;
    auVar85 = vsubps_avx(auVar252,auVar165);
    fVar232 = auVar165._0_4_;
    fVar155 = auVar60._0_4_;
    auVar157._0_4_ = fVar155 * fVar232;
    fVar218 = auVar165._4_4_;
    fVar160 = auVar60._4_4_;
    auVar157._4_4_ = fVar160 * fVar218;
    fVar227 = auVar165._8_4_;
    auVar157._8_4_ = fVar155 * fVar227;
    fVar228 = auVar165._12_4_;
    auVar157._12_4_ = fVar160 * fVar228;
    fVar164 = auVar41._0_4_;
    auVar166._0_4_ = fVar164 * fVar232;
    fVar175 = auVar41._4_4_;
    auVar166._4_4_ = fVar175 * fVar218;
    auVar166._8_4_ = fVar164 * fVar227;
    auVar166._12_4_ = fVar175 * fVar228;
    fVar178 = auVar42._0_4_;
    auVar179._0_4_ = fVar178 * fVar232;
    fVar185 = auVar42._4_4_;
    auVar179._4_4_ = fVar185 * fVar218;
    auVar179._8_4_ = fVar178 * fVar227;
    auVar179._12_4_ = fVar185 * fVar228;
    fVar186 = auVar44._0_4_;
    auVar145._0_4_ = fVar186 * fVar232;
    fVar191 = auVar44._4_4_;
    auVar145._4_4_ = fVar191 * fVar218;
    auVar145._8_4_ = fVar186 * fVar227;
    auVar145._12_4_ = fVar191 * fVar228;
    auVar82 = vfmadd231ps_avx512vl(auVar157,auVar85,auVar74);
    auVar83 = vfmadd231ps_avx512vl(auVar166,auVar85,auVar54);
    auVar84 = vfmadd231ps_avx512vl(auVar179,auVar85,auVar55);
    auVar85 = vfmadd231ps_avx512vl(auVar145,auVar75,auVar85);
    auVar165 = vmovshdup_avx(auVar53);
    fVar218 = auVar53._0_4_;
    fVar232 = (auVar165._0_4_ - fVar218) * 0.04761905;
    auVar172._4_4_ = fVar218;
    auVar172._0_4_ = fVar218;
    auVar172._8_4_ = fVar218;
    auVar172._12_4_ = fVar218;
    auVar172._16_4_ = fVar218;
    auVar172._20_4_ = fVar218;
    auVar172._24_4_ = fVar218;
    auVar172._28_4_ = fVar218;
    auVar109._0_8_ = auVar165._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar109._16_8_ = auVar109._0_8_;
    auVar109._24_8_ = auVar109._0_8_;
    auVar118 = vsubps_avx(auVar109,auVar172);
    uVar138 = auVar82._0_4_;
    auVar154._4_4_ = uVar138;
    auVar154._0_4_ = uVar138;
    auVar154._8_4_ = uVar138;
    auVar154._12_4_ = uVar138;
    auVar154._16_4_ = uVar138;
    auVar154._20_4_ = uVar138;
    auVar154._24_4_ = uVar138;
    auVar154._28_4_ = uVar138;
    auVar110._8_4_ = 1;
    auVar110._0_8_ = 0x100000001;
    auVar110._12_4_ = 1;
    auVar110._16_4_ = 1;
    auVar110._20_4_ = 1;
    auVar110._24_4_ = 1;
    auVar110._28_4_ = 1;
    auVar117 = ZEXT1632(auVar82);
    auVar114 = vpermps_avx2(auVar110,auVar117);
    auVar99 = vbroadcastss_avx512vl(auVar83);
    auVar115 = ZEXT1632(auVar83);
    auVar100 = vpermps_avx512vl(auVar110,auVar115);
    auVar101 = vbroadcastss_avx512vl(auVar84);
    auVar116 = ZEXT1632(auVar84);
    auVar102 = vpermps_avx512vl(auVar110,auVar116);
    auVar103 = vbroadcastss_avx512vl(auVar85);
    auVar113 = ZEXT1632(auVar85);
    auVar104 = vpermps_avx512vl(auVar110,auVar113);
    auVar216._4_4_ = fVar232;
    auVar216._0_4_ = fVar232;
    auVar216._8_4_ = fVar232;
    auVar216._12_4_ = fVar232;
    auVar216._16_4_ = fVar232;
    auVar216._20_4_ = fVar232;
    auVar216._24_4_ = fVar232;
    auVar216._28_4_ = fVar232;
    auVar111._8_4_ = 2;
    auVar111._0_8_ = 0x200000002;
    auVar111._12_4_ = 2;
    auVar111._16_4_ = 2;
    auVar111._20_4_ = 2;
    auVar111._24_4_ = 2;
    auVar111._28_4_ = 2;
    auVar105 = vpermps_avx512vl(auVar111,auVar117);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar107 = vpermps_avx512vl(auVar106,auVar117);
    auVar108 = vpermps_avx512vl(auVar111,auVar115);
    auVar109 = vpermps_avx512vl(auVar106,auVar115);
    auVar117 = vpermps_avx2(auVar111,auVar116);
    auVar110 = vpermps_avx512vl(auVar106,auVar116);
    auVar111 = vpermps_avx512vl(auVar111,auVar113);
    auVar112 = vpermps_avx512vl(auVar106,auVar113);
    auVar165 = vfmadd132ps_fma(auVar118,auVar172,_DAT_01f7b040);
    auVar118 = vsubps_avx(auVar255,ZEXT1632(auVar165));
    auVar106 = vmulps_avx512vl(auVar99,ZEXT1632(auVar165));
    auVar115 = ZEXT1632(auVar165);
    auVar113 = vmulps_avx512vl(auVar100,auVar115);
    auVar85 = vfmadd231ps_fma(auVar106,auVar118,auVar154);
    auVar82 = vfmadd231ps_fma(auVar113,auVar118,auVar114);
    auVar106 = vmulps_avx512vl(auVar101,auVar115);
    auVar113 = vmulps_avx512vl(auVar102,auVar115);
    auVar99 = vfmadd231ps_avx512vl(auVar106,auVar118,auVar99);
    auVar100 = vfmadd231ps_avx512vl(auVar113,auVar118,auVar100);
    auVar106 = vmulps_avx512vl(auVar103,auVar115);
    auVar154 = ZEXT1632(auVar165);
    auVar104 = vmulps_avx512vl(auVar104,auVar154);
    auVar101 = vfmadd231ps_avx512vl(auVar106,auVar118,auVar101);
    auVar102 = vfmadd231ps_avx512vl(auVar104,auVar118,auVar102);
    fVar227 = auVar165._0_4_;
    fVar228 = auVar165._4_4_;
    auVar106._4_4_ = fVar228 * auVar99._4_4_;
    auVar106._0_4_ = fVar227 * auVar99._0_4_;
    fVar229 = auVar165._8_4_;
    auVar106._8_4_ = fVar229 * auVar99._8_4_;
    fVar230 = auVar165._12_4_;
    auVar106._12_4_ = fVar230 * auVar99._12_4_;
    auVar106._16_4_ = auVar99._16_4_ * 0.0;
    auVar106._20_4_ = auVar99._20_4_ * 0.0;
    auVar106._24_4_ = auVar99._24_4_ * 0.0;
    auVar106._28_4_ = fVar218;
    auVar113._4_4_ = fVar228 * auVar100._4_4_;
    auVar113._0_4_ = fVar227 * auVar100._0_4_;
    auVar113._8_4_ = fVar229 * auVar100._8_4_;
    auVar113._12_4_ = fVar230 * auVar100._12_4_;
    auVar113._16_4_ = auVar100._16_4_ * 0.0;
    auVar113._20_4_ = auVar100._20_4_ * 0.0;
    auVar113._24_4_ = auVar100._24_4_ * 0.0;
    auVar113._28_4_ = auVar114._28_4_;
    auVar85 = vfmadd231ps_fma(auVar106,auVar118,ZEXT1632(auVar85));
    auVar82 = vfmadd231ps_fma(auVar113,auVar118,ZEXT1632(auVar82));
    auVar119._0_4_ = fVar227 * auVar101._0_4_;
    auVar119._4_4_ = fVar228 * auVar101._4_4_;
    auVar119._8_4_ = fVar229 * auVar101._8_4_;
    auVar119._12_4_ = fVar230 * auVar101._12_4_;
    auVar119._16_4_ = auVar101._16_4_ * 0.0;
    auVar119._20_4_ = auVar101._20_4_ * 0.0;
    auVar119._24_4_ = auVar101._24_4_ * 0.0;
    auVar119._28_4_ = 0;
    auVar115._4_4_ = fVar228 * auVar102._4_4_;
    auVar115._0_4_ = fVar227 * auVar102._0_4_;
    auVar115._8_4_ = fVar229 * auVar102._8_4_;
    auVar115._12_4_ = fVar230 * auVar102._12_4_;
    auVar115._16_4_ = auVar102._16_4_ * 0.0;
    auVar115._20_4_ = auVar102._20_4_ * 0.0;
    auVar115._24_4_ = auVar102._24_4_ * 0.0;
    auVar115._28_4_ = auVar101._28_4_;
    auVar83 = vfmadd231ps_fma(auVar119,auVar118,auVar99);
    auVar84 = vfmadd231ps_fma(auVar115,auVar118,auVar100);
    auVar116._28_4_ = auVar100._28_4_;
    auVar116._0_28_ =
         ZEXT1628(CONCAT412(fVar230 * auVar84._12_4_,
                            CONCAT48(fVar229 * auVar84._8_4_,
                                     CONCAT44(fVar228 * auVar84._4_4_,fVar227 * auVar84._0_4_))));
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar230 * auVar83._12_4_,
                                                 CONCAT48(fVar229 * auVar83._8_4_,
                                                          CONCAT44(fVar228 * auVar83._4_4_,
                                                                   fVar227 * auVar83._0_4_)))),
                              auVar118,ZEXT1632(auVar85));
    auVar97 = vfmadd231ps_fma(auVar116,auVar118,ZEXT1632(auVar82));
    auVar114 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar85));
    auVar99 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar82));
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar114 = vmulps_avx512vl(auVar114,auVar100);
    auVar99 = vmulps_avx512vl(auVar99,auVar100);
    auVar208._0_4_ = fVar232 * auVar114._0_4_;
    auVar208._4_4_ = fVar232 * auVar114._4_4_;
    auVar208._8_4_ = fVar232 * auVar114._8_4_;
    auVar208._12_4_ = fVar232 * auVar114._12_4_;
    auVar208._16_4_ = fVar232 * auVar114._16_4_;
    auVar208._20_4_ = fVar232 * auVar114._20_4_;
    auVar208._24_4_ = fVar232 * auVar114._24_4_;
    auVar208._28_4_ = 0;
    auVar114 = vmulps_avx512vl(auVar216,auVar99);
    auVar82 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
    auVar99 = vpermt2ps_avx512vl(ZEXT1632(auVar86),_DAT_01fb9fc0,ZEXT1632(auVar82));
    auVar101 = vpermt2ps_avx512vl(ZEXT1632(auVar97),_DAT_01fb9fc0,ZEXT1632(auVar82));
    auVar148._0_4_ = auVar208._0_4_ + auVar86._0_4_;
    auVar148._4_4_ = auVar208._4_4_ + auVar86._4_4_;
    auVar148._8_4_ = auVar208._8_4_ + auVar86._8_4_;
    auVar148._12_4_ = auVar208._12_4_ + auVar86._12_4_;
    auVar148._16_4_ = auVar208._16_4_ + 0.0;
    auVar148._20_4_ = auVar208._20_4_ + 0.0;
    auVar148._24_4_ = auVar208._24_4_ + 0.0;
    auVar148._28_4_ = 0;
    auVar119 = ZEXT1632(auVar82);
    auVar102 = vpermt2ps_avx512vl(auVar208,_DAT_01fb9fc0,auVar119);
    auVar103 = vaddps_avx512vl(ZEXT1632(auVar97),auVar114);
    auVar104 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,auVar119);
    auVar114 = vsubps_avx(auVar99,auVar102);
    auVar102 = vsubps_avx512vl(auVar101,auVar104);
    auVar104 = vmulps_avx512vl(auVar108,auVar154);
    auVar106 = vmulps_avx512vl(auVar109,auVar154);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar118,auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,auVar107);
    auVar113 = vmulps_avx512vl(auVar117,auVar154);
    auVar115 = vmulps_avx512vl(auVar110,auVar154);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,auVar108);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar118,auVar109);
    auVar116 = vmulps_avx512vl(auVar111,auVar154);
    auVar105 = vmulps_avx512vl(auVar112,auVar154);
    auVar85 = vfmadd231ps_fma(auVar116,auVar118,auVar117);
    auVar117 = vfmadd231ps_avx512vl(auVar105,auVar118,auVar110);
    auVar116 = vmulps_avx512vl(auVar154,auVar113);
    auVar107 = ZEXT1632(auVar165);
    auVar105 = vmulps_avx512vl(auVar107,auVar115);
    auVar104 = vfmadd231ps_avx512vl(auVar116,auVar118,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar105,auVar118,auVar106);
    auVar117 = vmulps_avx512vl(auVar107,auVar117);
    auVar113 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar230 * auVar85._12_4_,
                                             CONCAT48(fVar229 * auVar85._8_4_,
                                                      CONCAT44(fVar228 * auVar85._4_4_,
                                                               fVar227 * auVar85._0_4_)))),auVar118,
                          auVar113);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar118,auVar115);
    auVar105._4_4_ = fVar228 * auVar113._4_4_;
    auVar105._0_4_ = fVar227 * auVar113._0_4_;
    auVar105._8_4_ = fVar229 * auVar113._8_4_;
    auVar105._12_4_ = fVar230 * auVar113._12_4_;
    auVar105._16_4_ = auVar113._16_4_ * 0.0;
    auVar105._20_4_ = auVar113._20_4_ * 0.0;
    auVar105._24_4_ = auVar113._24_4_ * 0.0;
    auVar105._28_4_ = auVar110._28_4_;
    auVar115 = vmulps_avx512vl(auVar107,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar105,auVar118,auVar104);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,auVar118);
    auVar118 = vsubps_avx512vl(auVar113,auVar104);
    auVar117 = vsubps_avx512vl(auVar117,auVar106);
    auVar118 = vmulps_avx512vl(auVar118,auVar100);
    auVar117 = vmulps_avx512vl(auVar117,auVar100);
    fVar218 = fVar232 * auVar118._0_4_;
    fVar227 = fVar232 * auVar118._4_4_;
    auVar107._4_4_ = fVar227;
    auVar107._0_4_ = fVar218;
    fVar228 = fVar232 * auVar118._8_4_;
    auVar107._8_4_ = fVar228;
    fVar229 = fVar232 * auVar118._12_4_;
    auVar107._12_4_ = fVar229;
    fVar230 = fVar232 * auVar118._16_4_;
    auVar107._16_4_ = fVar230;
    fVar231 = fVar232 * auVar118._20_4_;
    auVar107._20_4_ = fVar231;
    fVar232 = fVar232 * auVar118._24_4_;
    auVar107._24_4_ = fVar232;
    auVar107._28_4_ = auVar118._28_4_;
    auVar117 = vmulps_avx512vl(auVar216,auVar117);
    auVar100 = vpermt2ps_avx512vl(auVar116,_DAT_01fb9fc0,auVar119);
    auVar104 = vpermt2ps_avx512vl(auVar115,_DAT_01fb9fc0,auVar119);
    auVar217._0_4_ = auVar116._0_4_ + fVar218;
    auVar217._4_4_ = auVar116._4_4_ + fVar227;
    auVar217._8_4_ = auVar116._8_4_ + fVar228;
    auVar217._12_4_ = auVar116._12_4_ + fVar229;
    auVar217._16_4_ = auVar116._16_4_ + fVar230;
    auVar217._20_4_ = auVar116._20_4_ + fVar231;
    auVar217._24_4_ = auVar116._24_4_ + fVar232;
    auVar217._28_4_ = auVar116._28_4_ + auVar118._28_4_;
    auVar118 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,ZEXT1632(auVar82));
    auVar106 = vaddps_avx512vl(auVar115,auVar117);
    auVar117 = vpermt2ps_avx512vl(auVar117,_DAT_01fb9fc0,ZEXT1632(auVar82));
    auVar118 = vsubps_avx(auVar100,auVar118);
    auVar117 = vsubps_avx512vl(auVar104,auVar117);
    auVar154 = ZEXT1632(auVar86);
    auVar113 = vsubps_avx512vl(auVar116,auVar154);
    auVar172 = ZEXT1632(auVar97);
    auVar105 = vsubps_avx512vl(auVar115,auVar172);
    auVar107 = vsubps_avx512vl(auVar100,auVar99);
    auVar113 = vaddps_avx512vl(auVar113,auVar107);
    auVar107 = vsubps_avx512vl(auVar104,auVar101);
    auVar105 = vaddps_avx512vl(auVar105,auVar107);
    auVar107 = vmulps_avx512vl(auVar172,auVar113);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar154,auVar105);
    auVar108 = vmulps_avx512vl(auVar103,auVar113);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar148,auVar105);
    auVar109 = vmulps_avx512vl(auVar102,auVar113);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar114,auVar105);
    auVar110 = vmulps_avx512vl(auVar101,auVar113);
    auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar99,auVar105);
    auVar111 = vmulps_avx512vl(auVar115,auVar113);
    auVar111 = vfnmadd231ps_avx512vl(auVar111,auVar116,auVar105);
    auVar112 = vmulps_avx512vl(auVar106,auVar113);
    auVar112 = vfnmadd231ps_avx512vl(auVar112,auVar217,auVar105);
    auVar119 = vmulps_avx512vl(auVar117,auVar113);
    auVar119 = vfnmadd231ps_avx512vl(auVar119,auVar118,auVar105);
    auVar113 = vmulps_avx512vl(auVar104,auVar113);
    auVar113 = vfnmadd231ps_avx512vl(auVar113,auVar100,auVar105);
    auVar105 = vminps_avx512vl(auVar107,auVar108);
    auVar107 = vmaxps_avx512vl(auVar107,auVar108);
    auVar108 = vminps_avx512vl(auVar109,auVar110);
    auVar105 = vminps_avx512vl(auVar105,auVar108);
    auVar108 = vmaxps_avx512vl(auVar109,auVar110);
    auVar107 = vmaxps_avx512vl(auVar107,auVar108);
    auVar108 = vminps_avx512vl(auVar111,auVar112);
    auVar109 = vmaxps_avx512vl(auVar111,auVar112);
    auVar110 = vminps_avx512vl(auVar119,auVar113);
    auVar108 = vminps_avx512vl(auVar108,auVar110);
    auVar105 = vminps_avx512vl(auVar105,auVar108);
    auVar113 = vmaxps_avx512vl(auVar119,auVar113);
    auVar113 = vmaxps_avx512vl(auVar109,auVar113);
    auVar113 = vmaxps_avx512vl(auVar107,auVar113);
    auVar165 = auVar113._0_16_;
    uVar13 = vcmpps_avx512vl(auVar105,auVar144,2);
    auVar108._4_4_ = uStack_74;
    auVar108._0_4_ = local_78;
    auVar108._8_4_ = uStack_70;
    auVar108._12_4_ = uStack_6c;
    auVar108._16_4_ = uStack_68;
    auVar108._20_4_ = uStack_64;
    auVar108._24_4_ = uStack_60;
    auVar108._28_4_ = uStack_5c;
    uVar14 = vcmpps_avx512vl(auVar113,auVar108,5);
    bVar27 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    if (bVar27 != 0) {
      auVar113 = vsubps_avx512vl(auVar99,auVar154);
      auVar105 = vsubps_avx512vl(auVar101,auVar172);
      auVar107 = vsubps_avx512vl(auVar100,auVar116);
      auVar113 = vaddps_avx512vl(auVar113,auVar107);
      auVar165 = auVar113._0_16_;
      auVar107 = vsubps_avx512vl(auVar104,auVar115);
      auVar105 = vaddps_avx512vl(auVar105,auVar107);
      auVar107 = vmulps_avx512vl(auVar172,auVar113);
      auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar105,auVar154);
      auVar103 = vmulps_avx512vl(auVar103,auVar113);
      auVar103 = vfnmadd213ps_avx512vl(auVar148,auVar105,auVar103);
      auVar102 = vmulps_avx512vl(auVar102,auVar113);
      auVar102 = vfnmadd213ps_avx512vl(auVar114,auVar105,auVar102);
      auVar114 = vmulps_avx512vl(auVar101,auVar113);
      auVar101 = vfnmadd231ps_avx512vl(auVar114,auVar105,auVar99);
      auVar114 = vmulps_avx512vl(auVar115,auVar113);
      auVar115 = vfnmadd231ps_avx512vl(auVar114,auVar105,auVar116);
      auVar114 = vmulps_avx512vl(auVar106,auVar113);
      auVar106 = vfnmadd213ps_avx512vl(auVar217,auVar105,auVar114);
      auVar114 = vmulps_avx512vl(auVar117,auVar113);
      auVar116 = vfnmadd213ps_avx512vl(auVar118,auVar105,auVar114);
      auVar118 = vmulps_avx512vl(auVar104,auVar113);
      auVar104 = vfnmadd231ps_avx512vl(auVar118,auVar100,auVar105);
      auVar114 = vminps_avx(auVar107,auVar103);
      auVar118 = vmaxps_avx(auVar107,auVar103);
      auVar99 = vminps_avx(auVar102,auVar101);
      auVar99 = vminps_avx(auVar114,auVar99);
      auVar114 = vmaxps_avx(auVar102,auVar101);
      auVar118 = vmaxps_avx(auVar118,auVar114);
      auVar117 = vminps_avx(auVar115,auVar106);
      auVar114 = vmaxps_avx(auVar115,auVar106);
      auVar100 = vminps_avx(auVar116,auVar104);
      auVar117 = vminps_avx(auVar117,auVar100);
      auVar117 = vminps_avx(auVar99,auVar117);
      auVar99 = vmaxps_avx(auVar116,auVar104);
      auVar114 = vmaxps_avx(auVar114,auVar99);
      auVar118 = vmaxps_avx(auVar118,auVar114);
      uVar13 = vcmpps_avx512vl(auVar118,auVar108,5);
      uVar14 = vcmpps_avx512vl(auVar117,auVar144,2);
      bVar27 = bVar27 & (byte)uVar13 & (byte)uVar14;
      if (bVar27 != 0) {
        mask_stack[uVar30] = (uint)bVar27;
        BVar3 = (BBox1f)vmovlps_avx(auVar53);
        cu_stack[uVar30] = BVar3;
        BVar3 = (BBox1f)vmovlps_avx(auVar43);
        cv_stack[uVar30] = BVar3;
        uVar30 = (ulong)((int)uVar30 + 1);
      }
    }
    auVar53 = vxorps_avx512vl(auVar165,auVar165);
    auVar263 = ZEXT1664(auVar53);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar271 = ZEXT1664(auVar53);
    auVar118 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar264 = ZEXT3264(auVar118);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar265 = ZEXT1664(auVar53);
    auVar266 = ZEXT464(0x3a83126f);
    auVar267 = ZEXT3264(_DAT_01fb9fe0);
    auVar118 = _DAT_01fb9fe0;
LAB_018f5c45:
    do {
      do {
        do {
          auVar85 = auVar269._0_16_;
          auVar165 = auVar263._0_16_;
          if ((int)uVar30 == 0) {
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar20._4_4_ = uVar138;
            auVar20._0_4_ = uVar138;
            auVar20._8_4_ = uVar138;
            auVar20._12_4_ = uVar138;
            uVar13 = vcmpps_avx512vl(auVar58,auVar20,2);
            uVar35 = (ulong)((uint)uVar35 & (uint)uVar35 + 0xf & (uint)uVar13);
            goto LAB_018f4bed;
          }
          uVar28 = (int)uVar30 - 1;
          uVar136 = mask_stack[uVar28];
          auVar43._8_8_ = 0;
          auVar43._0_4_ = cv_stack[uVar28].lower;
          auVar43._4_4_ = cv_stack[uVar28].upper;
          uVar40 = 0;
          for (uVar34 = (ulong)uVar136; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000
              ) {
            uVar40 = uVar40 + 1;
          }
          uVar31 = uVar136 - 1 & uVar136;
          bVar38 = uVar31 == 0;
          mask_stack[uVar28] = uVar31;
          if (bVar38) {
            uVar30 = (ulong)uVar28;
          }
          auVar139._8_8_ = 0;
          auVar139._0_8_ = uVar40;
          auVar53 = vpunpcklqdq_avx(auVar139,ZEXT416((int)uVar40 + 1));
          auVar53 = vcvtqq2ps_avx512vl(auVar53);
          auVar53 = vmulps_avx512vl(auVar53,auVar265._0_16_);
          fVar232 = cu_stack[uVar28].upper;
          auVar15._4_4_ = fVar232;
          auVar15._0_4_ = fVar232;
          auVar15._8_4_ = fVar232;
          auVar15._12_4_ = fVar232;
          auVar82 = vmulps_avx512vl(auVar53,auVar15);
          auVar53 = vsubps_avx512vl(auVar85,auVar53);
          fVar232 = cu_stack[uVar28].lower;
          auVar16._4_4_ = fVar232;
          auVar16._0_4_ = fVar232;
          auVar16._8_4_ = fVar232;
          auVar16._12_4_ = fVar232;
          auVar53 = vfmadd231ps_avx512vl(auVar82,auVar53,auVar16);
          auVar82 = vmovshdup_avx(auVar53);
          fVar232 = auVar82._0_4_ - auVar53._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar232));
          if (uVar136 == 0 || bVar38) goto LAB_018f5747;
          auVar82 = vshufps_avx(auVar43,auVar43,0x50);
          auVar83 = vucomiss_avx512f(ZEXT416((uint)fVar232));
          auVar266 = ZEXT1664(auVar83);
          auVar86 = vsubps_avx512vl(auVar85,auVar82);
          fVar218 = auVar82._0_4_;
          auVar167._0_4_ = fVar218 * fVar155;
          fVar227 = auVar82._4_4_;
          auVar167._4_4_ = fVar227 * fVar160;
          fVar228 = auVar82._8_4_;
          auVar167._8_4_ = fVar228 * fVar155;
          fVar229 = auVar82._12_4_;
          auVar167._12_4_ = fVar229 * fVar160;
          auVar180._0_4_ = fVar218 * fVar164;
          auVar180._4_4_ = fVar227 * fVar175;
          auVar180._8_4_ = fVar228 * fVar164;
          auVar180._12_4_ = fVar229 * fVar175;
          auVar187._0_4_ = fVar218 * fVar178;
          auVar187._4_4_ = fVar227 * fVar185;
          auVar187._8_4_ = fVar228 * fVar178;
          auVar187._12_4_ = fVar229 * fVar185;
          auVar149._0_4_ = fVar218 * fVar186;
          auVar149._4_4_ = fVar227 * fVar191;
          auVar149._8_4_ = fVar228 * fVar186;
          auVar149._12_4_ = fVar229 * fVar191;
          auVar82 = vfmadd231ps_fma(auVar167,auVar86,auVar74);
          auVar83 = vfmadd231ps_fma(auVar180,auVar86,auVar54);
          auVar84 = vfmadd231ps_fma(auVar187,auVar86,auVar55);
          auVar86 = vfmadd231ps_fma(auVar149,auVar86,auVar75);
          auVar112._16_16_ = auVar82;
          auVar112._0_16_ = auVar82;
          auVar173._16_16_ = auVar83;
          auVar173._0_16_ = auVar83;
          auVar184._16_16_ = auVar84;
          auVar184._0_16_ = auVar84;
          auVar114 = vpermps_avx512vl(auVar267._0_32_,ZEXT1632(auVar53));
          auVar118 = vsubps_avx(auVar173,auVar112);
          auVar83 = vfmadd213ps_fma(auVar118,auVar114,auVar112);
          auVar118 = vsubps_avx(auVar184,auVar173);
          auVar97 = vfmadd213ps_fma(auVar118,auVar114,auVar173);
          auVar82 = vsubps_avx(auVar86,auVar84);
          auVar174._16_16_ = auVar82;
          auVar174._0_16_ = auVar82;
          auVar82 = vfmadd213ps_fma(auVar174,auVar114,auVar184);
          auVar118 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar118,auVar114,ZEXT1632(auVar83));
          auVar118 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar97));
          auVar82 = vfmadd213ps_fma(auVar118,auVar114,ZEXT1632(auVar97));
          auVar118 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar83));
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar118,auVar114);
          auVar118 = vmulps_avx512vl(auVar118,auVar264._0_32_);
          auVar82 = vmulss_avx512f(ZEXT416((uint)fVar232),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar218 = auVar82._0_4_;
          auVar188._0_8_ =
               CONCAT44(auVar192._4_4_ + fVar218 * auVar118._4_4_,
                        auVar192._0_4_ + fVar218 * auVar118._0_4_);
          auVar188._8_4_ = auVar192._8_4_ + fVar218 * auVar118._8_4_;
          auVar188._12_4_ = auVar192._12_4_ + fVar218 * auVar118._12_4_;
          auVar168._0_4_ = fVar218 * auVar118._16_4_;
          auVar168._4_4_ = fVar218 * auVar118._20_4_;
          auVar168._8_4_ = fVar218 * auVar118._24_4_;
          auVar168._12_4_ = fVar218 * auVar118._28_4_;
          auVar93 = vsubps_avx((undefined1  [16])0x0,auVar168);
          auVar97 = vshufpd_avx(auVar192,auVar192,3);
          auVar94 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar82 = vsubps_avx(auVar97,auVar192);
          auVar83 = vsubps_avx(auVar94,(undefined1  [16])0x0);
          auVar200._0_4_ = auVar82._0_4_ + auVar83._0_4_;
          auVar200._4_4_ = auVar82._4_4_ + auVar83._4_4_;
          auVar200._8_4_ = auVar82._8_4_ + auVar83._8_4_;
          auVar200._12_4_ = auVar82._12_4_ + auVar83._12_4_;
          auVar82 = vshufps_avx(auVar192,auVar192,0xb1);
          auVar83 = vshufps_avx(auVar188,auVar188,0xb1);
          auVar84 = vshufps_avx(auVar93,auVar93,0xb1);
          auVar86 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar253._4_4_ = auVar200._0_4_;
          auVar253._0_4_ = auVar200._0_4_;
          auVar253._8_4_ = auVar200._0_4_;
          auVar253._12_4_ = auVar200._0_4_;
          auVar89 = vshufps_avx(auVar200,auVar200,0x55);
          fVar218 = auVar89._0_4_;
          auVar212._0_4_ = auVar82._0_4_ * fVar218;
          fVar227 = auVar89._4_4_;
          auVar212._4_4_ = auVar82._4_4_ * fVar227;
          fVar228 = auVar89._8_4_;
          auVar212._8_4_ = auVar82._8_4_ * fVar228;
          fVar229 = auVar89._12_4_;
          auVar212._12_4_ = auVar82._12_4_ * fVar229;
          auVar220._0_4_ = auVar83._0_4_ * fVar218;
          auVar220._4_4_ = auVar83._4_4_ * fVar227;
          auVar220._8_4_ = auVar83._8_4_ * fVar228;
          auVar220._12_4_ = auVar83._12_4_ * fVar229;
          auVar235._0_4_ = auVar84._0_4_ * fVar218;
          auVar235._4_4_ = auVar84._4_4_ * fVar227;
          auVar235._8_4_ = auVar84._8_4_ * fVar228;
          auVar235._12_4_ = auVar84._12_4_ * fVar229;
          auVar201._0_4_ = auVar86._0_4_ * fVar218;
          auVar201._4_4_ = auVar86._4_4_ * fVar227;
          auVar201._8_4_ = auVar86._8_4_ * fVar228;
          auVar201._12_4_ = auVar86._12_4_ * fVar229;
          auVar82 = vfmadd231ps_fma(auVar212,auVar253,auVar192);
          auVar83 = vfmadd231ps_fma(auVar220,auVar253,auVar188);
          auVar91 = vfmadd231ps_fma(auVar235,auVar253,auVar93);
          auVar92 = vfmadd231ps_fma(auVar201,(undefined1  [16])0x0,auVar253);
          auVar89 = vshufpd_avx(auVar82,auVar82,1);
          auVar90 = vshufpd_avx(auVar83,auVar83,1);
          auVar87 = vshufpd_avx512vl(auVar91,auVar91,1);
          auVar88 = vshufpd_avx512vl(auVar92,auVar92,1);
          auVar84 = vminss_avx(auVar82,auVar83);
          auVar82 = vmaxss_avx(auVar83,auVar82);
          auVar86 = vminss_avx(auVar91,auVar92);
          auVar83 = vmaxss_avx(auVar92,auVar91);
          auVar84 = vminss_avx(auVar84,auVar86);
          auVar82 = vmaxss_avx(auVar83,auVar82);
          auVar86 = vminss_avx(auVar89,auVar90);
          auVar83 = vmaxss_avx(auVar90,auVar89);
          auVar89 = vminss_avx512f(auVar87,auVar88);
          auVar90 = vmaxss_avx512f(auVar88,auVar87);
          auVar83 = vmaxss_avx(auVar90,auVar83);
          auVar118._0_16_ = vminss_avx512f(auVar86,auVar89);
          vucomiss_avx512f(auVar84);
          fVar227 = auVar83._0_4_;
          fVar218 = auVar82._0_4_;
          if (4 < (uint)uVar30) {
            bVar39 = fVar227 == -0.0001;
            bVar36 = NAN(fVar227);
            if (fVar227 <= -0.0001) goto LAB_018f5e70;
            break;
          }
LAB_018f5e70:
          auVar86 = vucomiss_avx512f(auVar118._0_16_);
          bVar39 = fVar227 <= -0.0001;
          bVar37 = -0.0001 < fVar218;
          bVar36 = bVar39;
          if (!bVar39) break;
          uVar13 = vcmpps_avx512vl(auVar84,auVar86,5);
          uVar14 = vcmpps_avx512vl(auVar118._0_16_,auVar86,5);
          bVar27 = (byte)uVar13 & (byte)uVar14 & 1;
          bVar39 = bVar37 && bVar27 == 0;
          bVar36 = bVar37 && bVar27 == 0;
        } while (!bVar37 || bVar27 != 0);
        vcmpss_avx512f(auVar84,auVar165,1);
        auVar90 = auVar270._0_16_;
        uVar13 = vcmpss_avx512f(auVar82,auVar165,1);
        bVar37 = (bool)((byte)uVar13 & 1);
        auVar121._16_16_ = auVar118._16_16_;
        auVar121._0_16_ = auVar90;
        iVar137 = auVar270._0_4_;
        auVar120._4_28_ = auVar121._4_28_;
        auVar120._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar137);
        vucomiss_avx512f(auVar120._0_16_);
        bVar36 = (bool)(!bVar39 | bVar36);
        bVar37 = bVar36 == false;
        auVar123._16_16_ = auVar118._16_16_;
        auVar123._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar122._4_28_ = auVar123._4_28_;
        auVar122._0_4_ = (uint)bVar36 * auVar263._0_4_ + (uint)!bVar36 * 0x7f800000;
        auVar89 = auVar122._0_16_;
        auVar125._16_16_ = auVar118._16_16_;
        auVar125._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar124._4_28_ = auVar125._4_28_;
        auVar124._0_4_ = (uint)bVar36 * auVar263._0_4_ + (uint)!bVar36 * -0x800000;
        auVar86 = auVar124._0_16_;
        uVar13 = vcmpss_avx512f(auVar118._0_16_,auVar165,1);
        bVar39 = (bool)((byte)uVar13 & 1);
        auVar127._16_16_ = auVar118._16_16_;
        auVar127._0_16_ = auVar90;
        auVar126._4_28_ = auVar127._4_28_;
        auVar126._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar137);
        vucomiss_avx512f(auVar126._0_16_);
        if ((bVar36) || (bVar37)) {
          auVar91 = vucomiss_avx512f(auVar84);
          if ((bVar36) || (bVar37)) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar92 = vxorps_avx512vl(auVar84,auVar19);
            auVar84 = vsubss_avx512f(auVar91,auVar84);
            auVar84 = vdivss_avx512f(auVar92,auVar84);
            auVar91 = vsubss_avx512f(auVar90,auVar84);
            auVar84 = vfmadd213ss_avx512f(auVar91,auVar165,auVar84);
            auVar91 = auVar84;
          }
          else {
            auVar91 = vxorps_avx512vl(auVar91,auVar91);
            vucomiss_avx512f(auVar91);
            if ((bVar36) || (auVar84 = auVar90, bVar37)) {
              auVar84 = SUB6416(ZEXT464(0xff800000),0);
              auVar91 = ZEXT416(0x7f800000);
            }
          }
          auVar89 = vminss_avx512f(auVar89,auVar91);
          auVar86 = vmaxss_avx(auVar84,auVar86);
        }
        uVar13 = vcmpss_avx512f(auVar83,auVar165,1);
        bVar39 = (bool)((byte)uVar13 & 1);
        fVar228 = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar137);
        if ((auVar120._0_4_ != fVar228) || (NAN(auVar120._0_4_) || NAN(fVar228))) {
          if ((fVar227 != fVar218) || (NAN(fVar227) || NAN(fVar218))) {
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar82 = vxorps_avx512vl(auVar82,auVar18);
            auVar202._0_4_ = auVar82._0_4_ / (fVar227 - fVar218);
            auVar202._4_12_ = auVar82._4_12_;
            auVar82 = vsubss_avx512f(auVar90,auVar202);
            auVar82 = vfmadd213ss_avx512f(auVar82,auVar165,auVar202);
            auVar83 = auVar82;
          }
          else if ((fVar218 != 0.0) ||
                  (auVar82 = auVar90, auVar83 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar218))) {
            auVar82 = SUB6416(ZEXT464(0xff800000),0);
            auVar83 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar89 = vminss_avx(auVar89,auVar83);
          auVar86 = vmaxss_avx(auVar82,auVar86);
        }
        bVar39 = auVar126._0_4_ != fVar228;
        auVar82 = vminss_avx512f(auVar89,auVar90);
        auVar129._16_16_ = auVar118._16_16_;
        auVar129._0_16_ = auVar89;
        auVar128._4_28_ = auVar129._4_28_;
        auVar128._0_4_ = (uint)bVar39 * auVar82._0_4_ + (uint)!bVar39 * auVar89._0_4_;
        auVar82 = vmaxss_avx512f(auVar90,auVar86);
        auVar131._16_16_ = auVar118._16_16_;
        auVar131._0_16_ = auVar86;
        auVar130._4_28_ = auVar131._4_28_;
        auVar130._0_4_ = (uint)bVar39 * auVar82._0_4_ + (uint)!bVar39 * auVar86._0_4_;
        auVar82 = vmaxss_avx512f(auVar165,auVar128._0_16_);
        auVar118._0_16_ = vminss_avx512f(auVar130._0_16_,auVar90);
      } while (auVar118._0_4_ < auVar82._0_4_);
      auVar91 = vmaxss_avx512f(auVar165,ZEXT416((uint)(auVar82._0_4_ + -0.1)));
      auVar92 = vminss_avx512f(ZEXT416((uint)(auVar118._0_4_ + 0.1)),auVar90);
      auVar150._0_8_ = auVar192._0_8_;
      auVar150._8_8_ = auVar150._0_8_;
      auVar221._8_8_ = auVar188._0_8_;
      auVar221._0_8_ = auVar188._0_8_;
      auVar236._8_8_ = auVar93._0_8_;
      auVar236._0_8_ = auVar93._0_8_;
      auVar82 = vshufpd_avx(auVar188,auVar188,3);
      auVar83 = vshufpd_avx(auVar93,auVar93,3);
      auVar84 = vshufps_avx(auVar91,auVar92,0);
      auVar89 = vsubps_avx512vl(auVar85,auVar84);
      fVar218 = auVar84._0_4_;
      auVar181._0_4_ = fVar218 * auVar97._0_4_;
      fVar227 = auVar84._4_4_;
      auVar181._4_4_ = fVar227 * auVar97._4_4_;
      fVar228 = auVar84._8_4_;
      auVar181._8_4_ = fVar228 * auVar97._8_4_;
      fVar229 = auVar84._12_4_;
      auVar181._12_4_ = fVar229 * auVar97._12_4_;
      auVar189._0_4_ = fVar218 * auVar82._0_4_;
      auVar189._4_4_ = fVar227 * auVar82._4_4_;
      auVar189._8_4_ = fVar228 * auVar82._8_4_;
      auVar189._12_4_ = fVar229 * auVar82._12_4_;
      auVar258._0_4_ = auVar83._0_4_ * fVar218;
      auVar258._4_4_ = auVar83._4_4_ * fVar227;
      auVar258._8_4_ = auVar83._8_4_ * fVar228;
      auVar258._12_4_ = auVar83._12_4_ * fVar229;
      auVar169._0_4_ = fVar218 * auVar94._0_4_;
      auVar169._4_4_ = fVar227 * auVar94._4_4_;
      auVar169._8_4_ = fVar228 * auVar94._8_4_;
      auVar169._12_4_ = fVar229 * auVar94._12_4_;
      auVar86 = vfmadd231ps_fma(auVar181,auVar89,auVar150);
      auVar97 = vfmadd231ps_fma(auVar189,auVar89,auVar221);
      auVar94 = vfmadd231ps_fma(auVar258,auVar89,auVar236);
      auVar89 = vfmadd231ps_fma(auVar169,auVar89,ZEXT816(0));
      auVar83 = vsubss_avx512f(auVar90,auVar91);
      auVar82 = vmovshdup_avx(auVar43);
      auVar192 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar91._0_4_)),auVar43,auVar83);
      auVar83 = vsubss_avx512f(auVar90,auVar92);
      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar92._0_4_)),auVar43,auVar83);
      auVar93 = vdivss_avx512f(auVar90,ZEXT416((uint)fVar232));
      auVar43 = vsubps_avx(auVar97,auVar86);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar83 = vmulps_avx512vl(auVar43,auVar91);
      auVar43 = vsubps_avx(auVar94,auVar97);
      auVar84 = vmulps_avx512vl(auVar43,auVar91);
      auVar43 = vsubps_avx(auVar89,auVar94);
      auVar43 = vmulps_avx512vl(auVar43,auVar91);
      auVar82 = vminps_avx(auVar84,auVar43);
      auVar43 = vmaxps_avx(auVar84,auVar43);
      auVar82 = vminps_avx(auVar83,auVar82);
      auVar43 = vmaxps_avx(auVar83,auVar43);
      auVar83 = vshufpd_avx(auVar82,auVar82,3);
      auVar84 = vshufpd_avx(auVar43,auVar43,3);
      auVar82 = vminps_avx(auVar82,auVar83);
      auVar43 = vmaxps_avx(auVar43,auVar84);
      fVar232 = auVar93._0_4_;
      auVar203._0_4_ = auVar82._0_4_ * fVar232;
      auVar203._4_4_ = auVar82._4_4_ * fVar232;
      auVar203._8_4_ = auVar82._8_4_ * fVar232;
      auVar203._12_4_ = auVar82._12_4_ * fVar232;
      auVar195._0_4_ = fVar232 * auVar43._0_4_;
      auVar195._4_4_ = fVar232 * auVar43._4_4_;
      auVar195._8_4_ = fVar232 * auVar43._8_4_;
      auVar195._12_4_ = fVar232 * auVar43._12_4_;
      auVar93 = vdivss_avx512f(auVar90,ZEXT416((uint)(auVar87._0_4_ - auVar192._0_4_)));
      auVar43 = vshufpd_avx(auVar86,auVar86,3);
      auVar82 = vshufpd_avx(auVar97,auVar97,3);
      auVar83 = vshufpd_avx(auVar94,auVar94,3);
      auVar84 = vshufpd_avx(auVar89,auVar89,3);
      auVar43 = vsubps_avx(auVar43,auVar86);
      auVar86 = vsubps_avx(auVar82,auVar97);
      auVar97 = vsubps_avx(auVar83,auVar94);
      auVar84 = vsubps_avx(auVar84,auVar89);
      auVar82 = vminps_avx(auVar43,auVar86);
      auVar43 = vmaxps_avx(auVar43,auVar86);
      auVar83 = vminps_avx(auVar97,auVar84);
      auVar83 = vminps_avx(auVar82,auVar83);
      auVar82 = vmaxps_avx(auVar97,auVar84);
      auVar43 = vmaxps_avx(auVar43,auVar82);
      fVar232 = auVar93._0_4_;
      auVar237._0_4_ = fVar232 * auVar83._0_4_;
      auVar237._4_4_ = fVar232 * auVar83._4_4_;
      auVar237._8_4_ = fVar232 * auVar83._8_4_;
      auVar237._12_4_ = fVar232 * auVar83._12_4_;
      auVar222._0_4_ = fVar232 * auVar43._0_4_;
      auVar222._4_4_ = fVar232 * auVar43._4_4_;
      auVar222._8_4_ = fVar232 * auVar43._8_4_;
      auVar222._12_4_ = fVar232 * auVar43._12_4_;
      auVar84 = vinsertps_avx(auVar53,auVar192,0x10);
      auVar88 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9f90,auVar87);
      auVar143._0_4_ = auVar84._0_4_ + auVar88._0_4_;
      auVar143._4_4_ = auVar84._4_4_ + auVar88._4_4_;
      auVar143._8_4_ = auVar84._8_4_ + auVar88._8_4_;
      auVar143._12_4_ = auVar84._12_4_ + auVar88._12_4_;
      auVar93 = vmulps_avx512vl(auVar143,auVar271._0_16_);
      auVar82 = vshufps_avx(auVar93,auVar93,0x54);
      uVar138 = auVar93._0_4_;
      auVar146._4_4_ = uVar138;
      auVar146._0_4_ = uVar138;
      auVar146._8_4_ = uVar138;
      auVar146._12_4_ = uVar138;
      auVar83 = vfmadd213ps_fma(auVar59,auVar146,auVar62);
      auVar86 = vfmadd213ps_fma(auVar57,auVar146,auVar61);
      auVar97 = vfmadd213ps_fma(auVar76,auVar146,auVar65);
      auVar43 = vsubps_avx(auVar86,auVar83);
      auVar83 = vfmadd213ps_fma(auVar43,auVar146,auVar83);
      auVar43 = vsubps_avx(auVar97,auVar86);
      auVar43 = vfmadd213ps_fma(auVar43,auVar146,auVar86);
      auVar43 = vsubps_avx(auVar43,auVar83);
      auVar83 = vfmadd231ps_fma(auVar83,auVar43,auVar146);
      auVar94 = vmulps_avx512vl(auVar43,auVar91);
      auVar245._8_8_ = auVar83._0_8_;
      auVar245._0_8_ = auVar83._0_8_;
      auVar43 = vshufpd_avx(auVar83,auVar83,3);
      auVar83 = vshufps_avx(auVar93,auVar93,0x55);
      auVar86 = vsubps_avx(auVar43,auVar245);
      auVar97 = vfmadd231ps_fma(auVar245,auVar83,auVar86);
      auVar259._8_8_ = auVar94._0_8_;
      auVar259._0_8_ = auVar94._0_8_;
      auVar43 = vshufpd_avx(auVar94,auVar94,3);
      auVar43 = vsubps_avx512vl(auVar43,auVar259);
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar83,auVar259);
      auVar147._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
      auVar147._8_4_ = auVar86._8_4_ ^ 0x80000000;
      auVar147._12_4_ = auVar86._12_4_ ^ 0x80000000;
      auVar83 = vmovshdup_avx512vl(auVar43);
      auVar260._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
      auVar260._8_4_ = auVar83._8_4_ ^ 0x80000000;
      auVar260._12_4_ = auVar83._12_4_ ^ 0x80000000;
      auVar94 = vmovshdup_avx512vl(auVar86);
      auVar89 = vpermt2ps_avx512vl(auVar260,ZEXT416(5),auVar86);
      auVar83 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar83._0_4_ * auVar86._0_4_)),auVar43,auVar94);
      auVar86 = vpermt2ps_avx512vl(auVar43,SUB6416(ZEXT464(4),0),auVar147);
      auVar170._0_4_ = auVar83._0_4_;
      auVar170._4_4_ = auVar170._0_4_;
      auVar170._8_4_ = auVar170._0_4_;
      auVar170._12_4_ = auVar170._0_4_;
      auVar43 = vdivps_avx(auVar89,auVar170);
      auVar95 = vdivps_avx512vl(auVar86,auVar170);
      fVar232 = auVar97._0_4_;
      auVar83 = vshufps_avx(auVar97,auVar97,0x55);
      auVar246._0_4_ = fVar232 * auVar43._0_4_ + auVar83._0_4_ * auVar95._0_4_;
      auVar246._4_4_ = fVar232 * auVar43._4_4_ + auVar83._4_4_ * auVar95._4_4_;
      auVar246._8_4_ = fVar232 * auVar43._8_4_ + auVar83._8_4_ * auVar95._8_4_;
      auVar246._12_4_ = fVar232 * auVar43._12_4_ + auVar83._12_4_ * auVar95._12_4_;
      auVar91 = vsubps_avx(auVar82,auVar246);
      auVar83 = vmovshdup_avx(auVar43);
      auVar82 = vinsertps_avx(auVar203,auVar237,0x1c);
      auVar261._0_4_ = auVar83._0_4_ * auVar82._0_4_;
      auVar261._4_4_ = auVar83._4_4_ * auVar82._4_4_;
      auVar261._8_4_ = auVar83._8_4_ * auVar82._8_4_;
      auVar261._12_4_ = auVar83._12_4_ * auVar82._12_4_;
      auVar92 = vinsertps_avx512f(auVar195,auVar222,0x1c);
      auVar83 = vmulps_avx512vl(auVar83,auVar92);
      auVar89 = vminps_avx512vl(auVar261,auVar83);
      auVar97 = vmaxps_avx(auVar83,auVar261);
      auVar94 = vmovshdup_avx(auVar95);
      auVar83 = vinsertps_avx(auVar237,auVar203,0x4c);
      auVar238._0_4_ = auVar94._0_4_ * auVar83._0_4_;
      auVar238._4_4_ = auVar94._4_4_ * auVar83._4_4_;
      auVar238._8_4_ = auVar94._8_4_ * auVar83._8_4_;
      auVar238._12_4_ = auVar94._12_4_ * auVar83._12_4_;
      auVar86 = vinsertps_avx(auVar222,auVar195,0x4c);
      auVar223._0_4_ = auVar94._0_4_ * auVar86._0_4_;
      auVar223._4_4_ = auVar94._4_4_ * auVar86._4_4_;
      auVar223._8_4_ = auVar94._8_4_ * auVar86._8_4_;
      auVar223._12_4_ = auVar94._12_4_ * auVar86._12_4_;
      auVar94 = vminps_avx(auVar238,auVar223);
      auVar89 = vaddps_avx512vl(auVar89,auVar94);
      auVar94 = vmaxps_avx(auVar223,auVar238);
      auVar224._0_4_ = auVar97._0_4_ + auVar94._0_4_;
      auVar224._4_4_ = auVar97._4_4_ + auVar94._4_4_;
      auVar224._8_4_ = auVar97._8_4_ + auVar94._8_4_;
      auVar224._12_4_ = auVar97._12_4_ + auVar94._12_4_;
      auVar239._8_8_ = 0x3f80000000000000;
      auVar239._0_8_ = 0x3f80000000000000;
      auVar97 = vsubps_avx(auVar239,auVar224);
      auVar94 = vsubps_avx(auVar239,auVar89);
      auVar89 = vsubps_avx(auVar84,auVar93);
      auVar93 = vsubps_avx(auVar88,auVar93);
      fVar229 = auVar89._0_4_;
      auVar262._0_4_ = fVar229 * auVar97._0_4_;
      fVar230 = auVar89._4_4_;
      auVar262._4_4_ = fVar230 * auVar97._4_4_;
      fVar231 = auVar89._8_4_;
      auVar262._8_4_ = fVar231 * auVar97._8_4_;
      fVar156 = auVar89._12_4_;
      auVar262._12_4_ = fVar156 * auVar97._12_4_;
      auVar96 = vbroadcastss_avx512vl(auVar43);
      auVar82 = vmulps_avx512vl(auVar96,auVar82);
      auVar92 = vmulps_avx512vl(auVar96,auVar92);
      auVar96 = vminps_avx512vl(auVar82,auVar92);
      auVar92 = vmaxps_avx512vl(auVar92,auVar82);
      auVar82 = vbroadcastss_avx512vl(auVar95);
      auVar83 = vmulps_avx512vl(auVar82,auVar83);
      auVar82 = vmulps_avx512vl(auVar82,auVar86);
      auVar86 = vminps_avx512vl(auVar83,auVar82);
      auVar86 = vaddps_avx512vl(auVar96,auVar86);
      auVar89 = vmulps_avx512vl(auVar89,auVar94);
      fVar232 = auVar93._0_4_;
      auVar225._0_4_ = fVar232 * auVar97._0_4_;
      fVar218 = auVar93._4_4_;
      auVar225._4_4_ = fVar218 * auVar97._4_4_;
      fVar227 = auVar93._8_4_;
      auVar225._8_4_ = fVar227 * auVar97._8_4_;
      fVar228 = auVar93._12_4_;
      auVar225._12_4_ = fVar228 * auVar97._12_4_;
      auVar240._0_4_ = fVar232 * auVar94._0_4_;
      auVar240._4_4_ = fVar218 * auVar94._4_4_;
      auVar240._8_4_ = fVar227 * auVar94._8_4_;
      auVar240._12_4_ = fVar228 * auVar94._12_4_;
      auVar82 = vmaxps_avx(auVar82,auVar83);
      auVar196._0_4_ = auVar92._0_4_ + auVar82._0_4_;
      auVar196._4_4_ = auVar92._4_4_ + auVar82._4_4_;
      auVar196._8_4_ = auVar92._8_4_ + auVar82._8_4_;
      auVar196._12_4_ = auVar92._12_4_ + auVar82._12_4_;
      auVar204._8_8_ = 0x3f800000;
      auVar204._0_8_ = 0x3f800000;
      auVar82 = vsubps_avx(auVar204,auVar196);
      auVar83 = vsubps_avx512vl(auVar204,auVar86);
      auVar254._0_4_ = fVar229 * auVar82._0_4_;
      auVar254._4_4_ = fVar230 * auVar82._4_4_;
      auVar254._8_4_ = fVar231 * auVar82._8_4_;
      auVar254._12_4_ = fVar156 * auVar82._12_4_;
      auVar247._0_4_ = fVar229 * auVar83._0_4_;
      auVar247._4_4_ = fVar230 * auVar83._4_4_;
      auVar247._8_4_ = fVar231 * auVar83._8_4_;
      auVar247._12_4_ = fVar156 * auVar83._12_4_;
      auVar197._0_4_ = fVar232 * auVar82._0_4_;
      auVar197._4_4_ = fVar218 * auVar82._4_4_;
      auVar197._8_4_ = fVar227 * auVar82._8_4_;
      auVar197._12_4_ = fVar228 * auVar82._12_4_;
      auVar205._0_4_ = fVar232 * auVar83._0_4_;
      auVar205._4_4_ = fVar218 * auVar83._4_4_;
      auVar205._8_4_ = fVar227 * auVar83._8_4_;
      auVar205._12_4_ = fVar228 * auVar83._12_4_;
      auVar82 = vminps_avx(auVar254,auVar247);
      auVar83 = vminps_avx512vl(auVar197,auVar205);
      auVar86 = vminps_avx512vl(auVar82,auVar83);
      auVar82 = vmaxps_avx(auVar247,auVar254);
      auVar83 = vmaxps_avx(auVar205,auVar197);
      auVar83 = vmaxps_avx(auVar83,auVar82);
      auVar97 = vminps_avx512vl(auVar262,auVar89);
      auVar82 = vminps_avx(auVar225,auVar240);
      auVar82 = vminps_avx(auVar97,auVar82);
      auVar82 = vhaddps_avx(auVar86,auVar82);
      auVar118._0_16_ = vmaxps_avx512vl(auVar89,auVar262);
      auVar86 = vmaxps_avx(auVar240,auVar225);
      auVar86 = vmaxps_avx(auVar86,auVar118._0_16_);
      auVar83 = vhaddps_avx(auVar83,auVar86);
      auVar82 = vshufps_avx(auVar82,auVar82,0xe8);
      auVar83 = vshufps_avx(auVar83,auVar83,0xe8);
      auVar198._0_4_ = auVar82._0_4_ + auVar91._0_4_;
      auVar198._4_4_ = auVar82._4_4_ + auVar91._4_4_;
      auVar198._8_4_ = auVar82._8_4_ + auVar91._8_4_;
      auVar198._12_4_ = auVar82._12_4_ + auVar91._12_4_;
      auVar206._0_4_ = auVar83._0_4_ + auVar91._0_4_;
      auVar206._4_4_ = auVar83._4_4_ + auVar91._4_4_;
      auVar206._8_4_ = auVar83._8_4_ + auVar91._8_4_;
      auVar206._12_4_ = auVar83._12_4_ + auVar91._12_4_;
      auVar82 = vmaxps_avx(auVar84,auVar198);
      auVar83 = vminps_avx(auVar206,auVar88);
      uVar40 = vcmpps_avx512vl(auVar83,auVar82,1);
    } while ((uVar40 & 3) != 0);
    uVar40 = vcmpps_avx512vl(auVar206,auVar88,1);
    uVar13 = vcmpps_avx512vl(auVar53,auVar198,1);
    if (((ushort)uVar13 & (ushort)uVar40 & 1) == 0) {
      bVar27 = 0;
    }
    else {
      auVar82 = vmovshdup_avx(auVar198);
      bVar27 = auVar192._0_4_ < auVar82._0_4_ & (byte)(uVar40 >> 1) & 0x7f;
    }
    p03.field_0.i[0] = auVar49._0_4_;
    p03.field_0.i[1] = auVar49._4_4_;
    p03.field_0.i[2] = auVar49._8_4_;
    p03.field_0.i[3] = auVar49._12_4_;
    if (((3 < (uint)uVar30 || uVar136 != 0 && !bVar38) | bVar27) == 1) {
      lVar32 = 0xc9;
      do {
        lVar32 = lVar32 + -1;
        if (lVar32 == 0) goto LAB_018f5c45;
        auVar53 = vsubss_avx512f(auVar90,auVar91);
        fVar227 = auVar53._0_4_;
        fVar232 = fVar227 * fVar227 * fVar227;
        auVar53 = vmulss_avx512f(auVar91,ZEXT416(0x40400000));
        fVar218 = auVar53._0_4_ * fVar227 * fVar227;
        fVar228 = auVar91._0_4_;
        auVar53 = vmulss_avx512f(ZEXT416((uint)(fVar228 * fVar228)),ZEXT416(0x40400000));
        fVar227 = fVar227 * auVar53._0_4_;
        auVar158._4_4_ = fVar232;
        auVar158._0_4_ = fVar232;
        auVar158._8_4_ = fVar232;
        auVar158._12_4_ = fVar232;
        auVar151._4_4_ = fVar218;
        auVar151._0_4_ = fVar218;
        auVar151._8_4_ = fVar218;
        auVar151._12_4_ = fVar218;
        auVar140._4_4_ = fVar227;
        auVar140._0_4_ = fVar227;
        auVar140._8_4_ = fVar227;
        auVar140._12_4_ = fVar227;
        fVar228 = fVar228 * fVar228 * fVar228;
        auVar182._0_4_ = p03.field_0.v[0] * fVar228;
        auVar182._4_4_ = p03.field_0.v[1] * fVar228;
        auVar182._8_4_ = p03.field_0.v[2] * fVar228;
        auVar182._12_4_ = p03.field_0.v[3] * fVar228;
        auVar53 = vfmadd231ps_fma(auVar182,auVar65,auVar140);
        auVar53 = vfmadd231ps_fma(auVar53,auVar61,auVar151);
        auVar53 = vfmadd231ps_fma(auVar53,auVar62,auVar158);
        auVar141._8_8_ = auVar53._0_8_;
        auVar141._0_8_ = auVar53._0_8_;
        auVar53 = vshufpd_avx(auVar53,auVar53,3);
        auVar82 = vshufps_avx(auVar91,auVar91,0x55);
        auVar53 = vsubps_avx(auVar53,auVar141);
        auVar82 = vfmadd213ps_fma(auVar53,auVar82,auVar141);
        fVar232 = auVar82._0_4_;
        auVar53 = vshufps_avx(auVar82,auVar82,0x55);
        auVar142._0_4_ = auVar43._0_4_ * fVar232 + auVar95._0_4_ * auVar53._0_4_;
        auVar142._4_4_ = auVar43._4_4_ * fVar232 + auVar95._4_4_ * auVar53._4_4_;
        auVar142._8_4_ = auVar43._8_4_ * fVar232 + auVar95._8_4_ * auVar53._8_4_;
        auVar142._12_4_ = auVar43._12_4_ * fVar232 + auVar95._12_4_ * auVar53._12_4_;
        auVar91 = vsubps_avx(auVar91,auVar142);
        auVar53 = vandps_avx512vl(auVar82,auVar268._0_16_);
        auVar118._0_16_ = vprolq_avx512vl(auVar53,0x20);
        auVar53 = vmaxss_avx(auVar118._0_16_,auVar53);
        bVar38 = auVar53._0_4_ <= fVar176;
      } while (fVar176 <= auVar53._0_4_);
      auVar53 = vucomiss_avx512f(auVar165);
      if (bVar38) {
        auVar43 = vucomiss_avx512f(auVar53);
        auVar270 = ZEXT1664(auVar43);
        if (bVar38) {
          vmovshdup_avx(auVar53);
          auVar43 = vucomiss_avx512f(auVar165);
          if (bVar38) {
            auVar82 = vucomiss_avx512f(auVar43);
            auVar270 = ZEXT1664(auVar82);
            if (bVar38) {
              auVar83 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar93 = vinsertps_avx(auVar83,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar83 = vdpps_avx(auVar93,auVar45,0x7f);
              auVar84 = vdpps_avx(auVar93,auVar69,0x7f);
              auVar86 = vdpps_avx(auVar93,auVar70,0x7f);
              auVar97 = vdpps_avx(auVar93,auVar47,0x7f);
              auVar94 = vdpps_avx(auVar93,auVar71,0x7f);
              auVar89 = vdpps_avx(auVar93,auVar72,0x7f);
              auVar90 = vdpps_avx(auVar93,auVar73,0x7f);
              auVar93 = vdpps_avx(auVar93,auVar48,0x7f);
              auVar91 = vsubss_avx512f(auVar82,auVar43);
              fVar228 = auVar43._0_4_;
              auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar94._0_4_)),auVar91,auVar83);
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar89._0_4_ * fVar228)),auVar91,auVar84);
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ * fVar228)),auVar91,auVar86);
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar93._0_4_)),auVar91,auVar97);
              auVar82 = vsubss_avx512f(auVar82,auVar53);
              auVar207._0_4_ = auVar82._0_4_;
              fVar232 = auVar207._0_4_ * auVar207._0_4_ * auVar207._0_4_;
              auVar82 = vmulss_avx512f(auVar53,ZEXT416(0x40400000));
              fVar218 = auVar82._0_4_ * auVar207._0_4_ * auVar207._0_4_;
              local_d8 = auVar53._0_4_;
              auVar159._0_4_ = local_d8 * local_d8;
              auVar159._4_4_ = auVar53._4_4_ * auVar53._4_4_;
              auVar159._8_4_ = auVar53._8_4_ * auVar53._8_4_;
              auVar159._12_4_ = auVar53._12_4_ * auVar53._12_4_;
              auVar118._0_16_ = vmulss_avx512f(auVar159,ZEXT416(0x40400000));
              fVar227 = auVar207._0_4_ * auVar118._0_4_;
              fVar230 = local_d8 * auVar159._0_4_;
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * auVar86._0_4_)),
                                        ZEXT416((uint)fVar227),auVar84);
              auVar82 = vfmadd231ss_fma(auVar82,ZEXT416((uint)fVar218),auVar83);
              auVar43 = vfmadd231ss_fma(auVar82,ZEXT416((uint)fVar232),auVar43);
              fVar229 = auVar43._0_4_;
              if ((fVar177 <= fVar229) &&
                 (fVar231 = *(float *)(ray + k * 4 + 0x80), fVar229 <= fVar231)) {
                local_c8 = vshufps_avx(auVar53,auVar53,0x55);
                auVar82 = vsubps_avx512vl(auVar85,local_c8);
                local_268 = auVar66._0_4_;
                fStack_264 = auVar66._4_4_;
                fStack_260 = auVar66._8_4_;
                fStack_25c = auVar66._12_4_;
                fVar156 = local_c8._0_4_;
                auVar213._0_4_ = fVar156 * local_268;
                fVar161 = local_c8._4_4_;
                auVar213._4_4_ = fVar161 * fStack_264;
                fVar162 = local_c8._8_4_;
                auVar213._8_4_ = fVar162 * fStack_260;
                fVar163 = local_c8._12_4_;
                auVar213._12_4_ = fVar163 * fStack_25c;
                local_278 = auVar67._0_4_;
                fStack_274 = auVar67._4_4_;
                fStack_270 = auVar67._8_4_;
                fStack_26c = auVar67._12_4_;
                auVar226._0_4_ = fVar156 * local_278;
                auVar226._4_4_ = fVar161 * fStack_274;
                auVar226._8_4_ = fVar162 * fStack_270;
                auVar226._12_4_ = fVar163 * fStack_26c;
                local_288 = auVar68._0_4_;
                fStack_284 = auVar68._4_4_;
                fStack_280 = auVar68._8_4_;
                fStack_27c = auVar68._12_4_;
                auVar241._0_4_ = fVar156 * local_288;
                auVar241._4_4_ = fVar161 * fStack_284;
                auVar241._8_4_ = fVar162 * fStack_280;
                auVar241._12_4_ = fVar163 * fStack_27c;
                local_298 = auVar51._0_4_;
                fStack_294 = auVar51._4_4_;
                fStack_290 = auVar51._8_4_;
                fStack_28c = auVar51._12_4_;
                auVar248._0_4_ = fVar156 * local_298;
                auVar248._4_4_ = fVar161 * fStack_294;
                auVar248._8_4_ = fVar162 * fStack_290;
                auVar248._12_4_ = fVar163 * fStack_28c;
                auVar53 = vfmadd231ps_fma(auVar213,auVar82,auVar46);
                auVar43 = vfmadd231ps_fma(auVar226,auVar82,auVar63);
                auVar85 = vfmadd231ps_fma(auVar241,auVar82,auVar64);
                auVar82 = vfmadd231ps_fma(auVar248,auVar82,auVar50);
                auVar53 = vsubps_avx(auVar43,auVar53);
                auVar43 = vsubps_avx(auVar85,auVar43);
                auVar85 = vsubps_avx(auVar82,auVar85);
                auVar249._0_4_ = local_d8 * auVar43._0_4_;
                auVar249._4_4_ = local_d8 * auVar43._4_4_;
                auVar249._8_4_ = local_d8 * auVar43._8_4_;
                auVar249._12_4_ = local_d8 * auVar43._12_4_;
                auVar207._4_4_ = auVar207._0_4_;
                auVar207._8_4_ = auVar207._0_4_;
                auVar207._12_4_ = auVar207._0_4_;
                auVar53 = vfmadd231ps_fma(auVar249,auVar207,auVar53);
                auVar214._0_4_ = local_d8 * auVar85._0_4_;
                auVar214._4_4_ = local_d8 * auVar85._4_4_;
                auVar214._8_4_ = local_d8 * auVar85._8_4_;
                auVar214._12_4_ = local_d8 * auVar85._12_4_;
                auVar43 = vfmadd231ps_fma(auVar214,auVar207,auVar43);
                auVar215._0_4_ = local_d8 * auVar43._0_4_;
                auVar215._4_4_ = local_d8 * auVar43._4_4_;
                auVar215._8_4_ = local_d8 * auVar43._8_4_;
                auVar215._12_4_ = local_d8 * auVar43._12_4_;
                auVar53 = vfmadd231ps_fma(auVar215,auVar207,auVar53);
                auVar17._8_4_ = 0x40400000;
                auVar17._0_8_ = 0x4040000040400000;
                auVar17._12_4_ = 0x40400000;
                auVar118._0_16_ = vmulps_avx512vl(auVar53,auVar17);
                pGVar7 = (context->scene->geometries).items[uVar29].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_2d8 = auVar52._0_4_;
                  fStack_2d4 = auVar52._4_4_;
                  fStack_2d0 = auVar52._8_4_;
                  fStack_2cc = auVar52._12_4_;
                  auVar190._0_4_ = fVar230 * local_2d8;
                  auVar190._4_4_ = fVar230 * fStack_2d4;
                  auVar190._8_4_ = fVar230 * fStack_2d0;
                  auVar190._12_4_ = fVar230 * fStack_2cc;
                  auVar183._4_4_ = fVar227;
                  auVar183._0_4_ = fVar227;
                  auVar183._8_4_ = fVar227;
                  auVar183._12_4_ = fVar227;
                  auVar53 = vfmadd132ps_fma(auVar183,auVar190,auVar79);
                  auVar171._4_4_ = fVar218;
                  auVar171._0_4_ = fVar218;
                  auVar171._8_4_ = fVar218;
                  auVar171._12_4_ = fVar218;
                  auVar53 = vfmadd132ps_fma(auVar171,auVar53,auVar78);
                  auVar152._4_4_ = fVar232;
                  auVar152._0_4_ = fVar232;
                  auVar152._8_4_ = fVar232;
                  auVar152._12_4_ = fVar232;
                  auVar85 = vfmadd132ps_fma(auVar152,auVar53,auVar77);
                  auVar53 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar43 = vshufps_avx(auVar118._0_16_,auVar118._0_16_,0xc9);
                  auVar153._0_4_ = auVar85._0_4_ * auVar43._0_4_;
                  auVar153._4_4_ = auVar85._4_4_ * auVar43._4_4_;
                  auVar153._8_4_ = auVar85._8_4_ * auVar43._8_4_;
                  auVar153._12_4_ = auVar85._12_4_ * auVar43._12_4_;
                  auVar53 = vfmsub231ps_fma(auVar153,auVar118._0_16_,auVar53);
                  local_e8 = auVar53._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar229;
                    uVar138 = vextractps_avx(auVar53,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar138;
                    uVar138 = vextractps_avx(auVar53,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar138;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                    *(float *)(ray + k * 4 + 0xf0) = local_d8;
                    *(float *)(ray + k * 4 + 0x100) = fVar228;
                    *(uint *)(ray + k * 4 + 0x110) = uVar6;
                    *(int *)(ray + k * 4 + 0x120) = (int)uVar29;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_018f5c45;
                  }
                  auVar43 = vshufps_avx(auVar53,auVar53,0x55);
                  local_f8 = vshufps_avx(auVar53,auVar53,0xaa);
                  local_108[0] = (RTCHitN)auVar43[0];
                  local_108[1] = (RTCHitN)auVar43[1];
                  local_108[2] = (RTCHitN)auVar43[2];
                  local_108[3] = (RTCHitN)auVar43[3];
                  local_108[4] = (RTCHitN)auVar43[4];
                  local_108[5] = (RTCHitN)auVar43[5];
                  local_108[6] = (RTCHitN)auVar43[6];
                  local_108[7] = (RTCHitN)auVar43[7];
                  local_108[8] = (RTCHitN)auVar43[8];
                  local_108[9] = (RTCHitN)auVar43[9];
                  local_108[10] = (RTCHitN)auVar43[10];
                  local_108[0xb] = (RTCHitN)auVar43[0xb];
                  local_108[0xc] = (RTCHitN)auVar43[0xc];
                  local_108[0xd] = (RTCHitN)auVar43[0xd];
                  local_108[0xe] = (RTCHitN)auVar43[0xe];
                  local_108[0xf] = (RTCHitN)auVar43[0xf];
                  uStack_e4 = local_e8;
                  uStack_e0 = local_e8;
                  uStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  local_308 = auVar81._0_8_;
                  uStack_300 = auVar81._8_8_;
                  local_b8 = local_308;
                  uStack_b0 = uStack_300;
                  local_a8 = auVar80;
                  vpcmpeqd_avx2(ZEXT1632(auVar80),ZEXT1632(auVar80));
                  uStack_94 = context->user->instID[0];
                  local_98 = uStack_94;
                  uStack_90 = uStack_94;
                  uStack_8c = uStack_94;
                  uStack_88 = context->user->instPrimID[0];
                  uStack_84 = uStack_88;
                  uStack_80 = uStack_88;
                  uStack_7c = uStack_88;
                  *(float *)(ray + k * 4 + 0x80) = fVar229;
                  args.valid = (int *)local_378;
                  args.geometryUserPtr = pGVar7->userPtr;
                  args.context = context->user;
                  args.hit = local_108;
                  args.N = 4;
                  local_378 = auVar56;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_368 = uVar29;
                    (*pGVar7->intersectionFilterN)(&args);
                    auVar267 = ZEXT3264(_DAT_01fb9fe0);
                    auVar266 = ZEXT464(0x3a83126f);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar265 = ZEXT1664(auVar53);
                    auVar118 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar264 = ZEXT3264(auVar118);
                    auVar270 = ZEXT464(0x3f800000);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar271 = ZEXT1664(auVar53);
                    auVar53 = vxorps_avx512vl(auVar165,auVar165);
                    auVar263 = ZEXT1664(auVar53);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar269 = ZEXT1664(auVar53);
                    auVar118._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar268 = ZEXT1664(auVar118._0_16_);
                    uVar29 = local_368;
                  }
                  auVar53 = auVar263._0_16_;
                  uVar40 = vptestmd_avx512vl(local_378,local_378);
                  if ((uVar40 & 0xf) != 0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&args);
                      auVar267 = ZEXT3264(_DAT_01fb9fe0);
                      auVar266 = ZEXT464(0x3a83126f);
                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar265 = ZEXT1664(auVar43);
                      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar264 = ZEXT3264(auVar118);
                      auVar270 = ZEXT464(0x3f800000);
                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar271 = ZEXT1664(auVar43);
                      auVar53 = vxorps_avx512vl(auVar53,auVar53);
                      auVar263 = ZEXT1664(auVar53);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar269 = ZEXT1664(auVar53);
                      auVar118._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar268 = ZEXT1664(auVar118._0_16_);
                    }
                    uVar40 = vptestmd_avx512vl(local_378,local_378);
                    uVar40 = uVar40 & 0xf;
                    bVar27 = (byte)uVar40;
                    if (bVar27 != 0) {
                      iVar137 = *(int *)(args.hit + 4);
                      iVar25 = *(int *)(args.hit + 8);
                      iVar26 = *(int *)(args.hit + 0xc);
                      auVar132._16_16_ = auVar118._16_16_;
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
                      bVar36 = SUB81(uVar40 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar27 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar38 * iVar137 | (uint)!bVar38 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar36 * iVar26 | (uint)!bVar36 * *(int *)(args.ray + 0xcc);
                      iVar137 = *(int *)(args.hit + 0x14);
                      iVar25 = *(int *)(args.hit + 0x18);
                      iVar26 = *(int *)(args.hit + 0x1c);
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
                      bVar36 = SUB81(uVar40 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar38 * iVar137 | (uint)!bVar38 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar36 * iVar26 | (uint)!bVar36 * *(int *)(args.ray + 0xdc);
                      iVar137 = *(int *)(args.hit + 0x24);
                      iVar25 = *(int *)(args.hit + 0x28);
                      iVar26 = *(int *)(args.hit + 0x2c);
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
                      bVar36 = SUB81(uVar40 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar38 * iVar137 | (uint)!bVar38 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar36 * iVar26 | (uint)!bVar36 * *(int *)(args.ray + 0xec);
                      iVar137 = *(int *)(args.hit + 0x34);
                      iVar25 = *(int *)(args.hit + 0x38);
                      iVar26 = *(int *)(args.hit + 0x3c);
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
                      bVar36 = SUB81(uVar40 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar38 * iVar137 | (uint)!bVar38 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar39 * iVar25 | (uint)!bVar39 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar36 * iVar26 | (uint)!bVar36 * *(int *)(args.ray + 0xfc);
                      iVar137 = *(int *)(args.ray + 0x104);
                      iVar25 = *(int *)(args.ray + 0x108);
                      iVar26 = *(int *)(args.ray + 0x10c);
                      auVar98._0_4_ =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(args.ray + 0x100);
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      auVar98._4_4_ =
                           (uint)bVar38 * *(int *)(args.hit + 0x44) | (uint)!bVar38 * iVar137;
                      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                      auVar98._8_4_ =
                           (uint)bVar38 * *(int *)(args.hit + 0x48) | (uint)!bVar38 * iVar25;
                      bVar38 = SUB81(uVar40 >> 3,0);
                      auVar98._12_4_ =
                           (uint)bVar38 * *(int *)(args.hit + 0x4c) | (uint)!bVar38 * iVar26;
                      auVar132._0_16_ = auVar98;
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar98;
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      uVar136 = bVar38 * auVar98._4_4_ | (uint)!bVar38 * iVar137;
                      auVar21._4_24_ = auVar132._8_24_;
                      auVar21._0_4_ = uVar136;
                      auVar133._0_8_ = auVar21._0_8_ << 0x20;
                      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                      auVar133._8_4_ = bVar38 * auVar98._8_4_ | (uint)!bVar38 * iVar25;
                      bVar38 = SUB81(uVar40 >> 3,0);
                      auVar133._12_4_ = bVar38 * auVar98._12_4_ | (uint)!bVar38 * iVar26;
                      auVar133._16_16_ = auVar132._16_16_;
                      auVar53 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar53;
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      uVar136 = bVar38 * uVar136 | (uint)!bVar38 * iVar137;
                      auVar22._4_24_ = auVar133._8_24_;
                      auVar22._0_4_ = uVar136;
                      auVar134._0_8_ = auVar22._0_8_ << 0x20;
                      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                      auVar134._8_4_ = bVar38 * auVar133._8_4_ | (uint)!bVar38 * iVar25;
                      bVar38 = SUB81(uVar40 >> 3,0);
                      auVar134._12_4_ = bVar38 * auVar133._12_4_ | (uint)!bVar38 * iVar26;
                      auVar134._16_16_ = auVar132._16_16_;
                      auVar53 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar53;
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      uVar136 = bVar38 * uVar136 | (uint)!bVar38 * iVar137;
                      auVar23._4_24_ = auVar134._8_24_;
                      auVar23._0_4_ = uVar136;
                      auVar135._0_8_ = auVar23._0_8_ << 0x20;
                      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                      auVar135._8_4_ = bVar38 * auVar134._8_4_ | (uint)!bVar38 * iVar25;
                      bVar38 = SUB81(uVar40 >> 3,0);
                      auVar135._12_4_ = bVar38 * auVar134._12_4_ | (uint)!bVar38 * iVar26;
                      auVar135._16_16_ = auVar132._16_16_;
                      auVar53 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar53;
                      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                      auVar24._4_24_ = auVar135._8_24_;
                      auVar24._0_4_ = bVar38 * uVar136 | (uint)!bVar38 * iVar137;
                      auVar118._0_8_ = auVar24._0_8_ << 0x20;
                      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                      auVar118._8_4_ = bVar38 * auVar135._8_4_ | (uint)!bVar38 * iVar25;
                      bVar38 = SUB81(uVar40 >> 3,0);
                      auVar118._12_4_ = bVar38 * auVar135._12_4_ | (uint)!bVar38 * iVar26;
                      auVar118._16_16_ = auVar132._16_16_;
                      auVar53 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar53;
                      goto LAB_018f5c45;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar231;
                }
              }
            }
          }
        }
      }
      goto LAB_018f5c45;
    }
    auVar43 = vinsertps_avx(auVar192,auVar87,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }